

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  Geometry *pGVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [12];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  byte bVar55;
  ulong uVar56;
  byte bVar57;
  byte bVar58;
  ulong uVar59;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ulong uVar60;
  uint uVar61;
  byte bVar62;
  byte bVar63;
  float fVar64;
  byte bVar65;
  byte bVar66;
  uint uVar67;
  long lVar68;
  undefined1 uVar69;
  bool bVar70;
  undefined1 uVar71;
  bool bVar72;
  ulong uVar73;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar81 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  uint uVar144;
  float pp;
  float fVar145;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar161 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar162 [64];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar163;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  float fVar204;
  undefined4 uVar205;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  float fVar225;
  float fVar232;
  float fVar233;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar234;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar235;
  float fVar236;
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  float fVar240;
  undefined1 auVar239 [28];
  undefined1 auVar241 [32];
  float fVar244;
  float fVar245;
  undefined1 auVar242 [16];
  float fVar246;
  undefined1 auVar243 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_9c0 [16];
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  RTCHitN local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  uint local_2a0;
  uint uStack_29c;
  uint uStack_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  uint uStack_288;
  uint uStack_284;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte local_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  undefined8 local_140;
  float local_138 [66];
  undefined1 extraout_var_02 [60];
  
  PVar2 = prim[1];
  uVar56 = (ulong)(byte)PVar2;
  fVar64 = *(float *)(prim + uVar56 * 0x19 + 0x12);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar80 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar81 = vsubps_avx(auVar13,*(undefined1 (*) [16])(prim + uVar56 * 0x19 + 6));
  fVar204 = fVar64 * auVar81._0_4_;
  fVar145 = fVar64 * auVar80._0_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar56 * 4 + 6);
  auVar87 = vpmovsxbd_avx2(auVar13);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar56 * 5 + 6);
  auVar86 = vpmovsxbd_avx2(auVar14);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar56 * 6 + 6);
  auVar88 = vpmovsxbd_avx2(auVar74);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar56 * 0xb + 6);
  auVar89 = vpmovsxbd_avx2(auVar76);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar90 = vpmovsxbd_avx2(auVar77);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar56 + 6);
  auVar91 = vpmovsxbd_avx2(auVar78);
  auVar91 = vcvtdq2ps_avx(auVar91);
  uVar59 = (ulong)(uint)((int)(uVar56 * 9) * 2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar59 + 6);
  auVar92 = vpmovsxbd_avx2(auVar1);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar59 + uVar56 + 6);
  auVar95 = vpmovsxbd_avx2(auVar75);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar93 = vcvtdq2ps_avx(auVar95);
  uVar73 = (ulong)(uint)((int)(uVar56 * 5) << 2);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar84 = vpmovsxbd_avx2(auVar79);
  auVar94 = vcvtdq2ps_avx(auVar84);
  auVar102._4_4_ = fVar145;
  auVar102._0_4_ = fVar145;
  auVar102._8_4_ = fVar145;
  auVar102._12_4_ = fVar145;
  auVar102._16_4_ = fVar145;
  auVar102._20_4_ = fVar145;
  auVar102._24_4_ = fVar145;
  auVar102._28_4_ = fVar145;
  auVar104._8_4_ = 1;
  auVar104._0_8_ = 0x100000001;
  auVar104._12_4_ = 1;
  auVar104._16_4_ = 1;
  auVar104._20_4_ = 1;
  auVar104._24_4_ = 1;
  auVar104._28_4_ = 1;
  auVar96 = ZEXT1632(CONCAT412(fVar64 * auVar80._12_4_,
                               CONCAT48(fVar64 * auVar80._8_4_,
                                        CONCAT44(fVar64 * auVar80._4_4_,fVar145))));
  auVar85 = vpermps_avx2(auVar104,auVar96);
  auVar82 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar83 = vpermps_avx512vl(auVar82,auVar96);
  fVar145 = auVar83._0_4_;
  fVar225 = auVar83._4_4_;
  auVar96._4_4_ = fVar225 * auVar88._4_4_;
  auVar96._0_4_ = fVar145 * auVar88._0_4_;
  fVar232 = auVar83._8_4_;
  auVar96._8_4_ = fVar232 * auVar88._8_4_;
  fVar233 = auVar83._12_4_;
  auVar96._12_4_ = fVar233 * auVar88._12_4_;
  fVar234 = auVar83._16_4_;
  auVar96._16_4_ = fVar234 * auVar88._16_4_;
  fVar240 = auVar83._20_4_;
  auVar96._20_4_ = fVar240 * auVar88._20_4_;
  fVar235 = auVar83._24_4_;
  auVar96._24_4_ = fVar235 * auVar88._24_4_;
  auVar96._28_4_ = auVar95._28_4_;
  auVar95._4_4_ = auVar91._4_4_ * fVar225;
  auVar95._0_4_ = auVar91._0_4_ * fVar145;
  auVar95._8_4_ = auVar91._8_4_ * fVar232;
  auVar95._12_4_ = auVar91._12_4_ * fVar233;
  auVar95._16_4_ = auVar91._16_4_ * fVar234;
  auVar95._20_4_ = auVar91._20_4_ * fVar240;
  auVar95._24_4_ = auVar91._24_4_ * fVar235;
  auVar95._28_4_ = auVar84._28_4_;
  auVar84._4_4_ = auVar94._4_4_ * fVar225;
  auVar84._0_4_ = auVar94._0_4_ * fVar145;
  auVar84._8_4_ = auVar94._8_4_ * fVar232;
  auVar84._12_4_ = auVar94._12_4_ * fVar233;
  auVar84._16_4_ = auVar94._16_4_ * fVar234;
  auVar84._20_4_ = auVar94._20_4_ * fVar240;
  auVar84._24_4_ = auVar94._24_4_ * fVar235;
  auVar84._28_4_ = auVar83._28_4_;
  auVar13 = vfmadd231ps_fma(auVar96,auVar85,auVar86);
  auVar14 = vfmadd231ps_fma(auVar95,auVar85,auVar90);
  auVar74 = vfmadd231ps_fma(auVar84,auVar93,auVar85);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar102,auVar87);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar102,auVar89);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar92,auVar102);
  auVar103._4_4_ = fVar204;
  auVar103._0_4_ = fVar204;
  auVar103._8_4_ = fVar204;
  auVar103._12_4_ = fVar204;
  auVar103._16_4_ = fVar204;
  auVar103._20_4_ = fVar204;
  auVar103._24_4_ = fVar204;
  auVar103._28_4_ = fVar204;
  auVar84 = ZEXT1632(CONCAT412(fVar64 * auVar81._12_4_,
                               CONCAT48(fVar64 * auVar81._8_4_,
                                        CONCAT44(fVar64 * auVar81._4_4_,fVar204))));
  auVar95 = vpermps_avx2(auVar104,auVar84);
  auVar84 = vpermps_avx512vl(auVar82,auVar84);
  auVar85 = vmulps_avx512vl(auVar84,auVar88);
  auVar98._0_4_ = auVar84._0_4_ * auVar91._0_4_;
  auVar98._4_4_ = auVar84._4_4_ * auVar91._4_4_;
  auVar98._8_4_ = auVar84._8_4_ * auVar91._8_4_;
  auVar98._12_4_ = auVar84._12_4_ * auVar91._12_4_;
  auVar98._16_4_ = auVar84._16_4_ * auVar91._16_4_;
  auVar98._20_4_ = auVar84._20_4_ * auVar91._20_4_;
  auVar98._24_4_ = auVar84._24_4_ * auVar91._24_4_;
  auVar98._28_4_ = 0;
  auVar91._4_4_ = auVar84._4_4_ * auVar94._4_4_;
  auVar91._0_4_ = auVar84._0_4_ * auVar94._0_4_;
  auVar91._8_4_ = auVar84._8_4_ * auVar94._8_4_;
  auVar91._12_4_ = auVar84._12_4_ * auVar94._12_4_;
  auVar91._16_4_ = auVar84._16_4_ * auVar94._16_4_;
  auVar91._20_4_ = auVar84._20_4_ * auVar94._20_4_;
  auVar91._24_4_ = auVar84._24_4_ * auVar94._24_4_;
  auVar91._28_4_ = auVar88._28_4_;
  auVar86 = vfmadd231ps_avx512vl(auVar85,auVar95,auVar86);
  auVar76 = vfmadd231ps_fma(auVar98,auVar95,auVar90);
  auVar77 = vfmadd231ps_fma(auVar91,auVar95,auVar93);
  auVar86 = vfmadd231ps_avx512vl(auVar86,auVar103,auVar87);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar103,auVar89);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar103,auVar92);
  auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar250 = ZEXT3264(auVar87);
  vandps_avx512vl(ZEXT1632(auVar13),auVar87);
  auVar100._8_4_ = 0x219392ef;
  auVar100._0_8_ = 0x219392ef219392ef;
  auVar100._12_4_ = 0x219392ef;
  auVar100._16_4_ = 0x219392ef;
  auVar100._20_4_ = 0x219392ef;
  auVar100._24_4_ = 0x219392ef;
  auVar100._28_4_ = 0x219392ef;
  uVar59 = vcmpps_avx512vl(auVar87,auVar100,1);
  bVar72 = (bool)((byte)uVar59 & 1);
  auVar85._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar13._0_4_;
  bVar72 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar13._4_4_;
  bVar72 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar13._8_4_;
  bVar72 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar13._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar14),auVar87);
  uVar59 = vcmpps_avx512vl(auVar85,auVar100,1);
  bVar72 = (bool)((byte)uVar59 & 1);
  auVar82._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar14._0_4_;
  bVar72 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar14._4_4_;
  bVar72 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar14._8_4_;
  bVar72 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar14._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar74),auVar87);
  uVar59 = vcmpps_avx512vl(auVar82,auVar100,1);
  bVar72 = (bool)((byte)uVar59 & 1);
  auVar87._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar74._0_4_;
  bVar72 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar74._4_4_;
  bVar72 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar74._8_4_;
  bVar72 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar74._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar88 = vrcp14ps_avx512vl(auVar85);
  auVar101._8_4_ = 0x3f800000;
  auVar101._0_8_ = &DAT_3f8000003f800000;
  auVar101._12_4_ = 0x3f800000;
  auVar101._16_4_ = 0x3f800000;
  auVar101._20_4_ = 0x3f800000;
  auVar101._24_4_ = 0x3f800000;
  auVar101._28_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar85,auVar88,auVar101);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar82);
  auVar14 = vfnmadd213ps_fma(auVar82,auVar88,auVar101);
  auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar87);
  auVar74 = vfnmadd213ps_fma(auVar87,auVar88,auVar101);
  auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar88,auVar88);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 7 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar88 = vsubps_avx512vl(auVar87,auVar86);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 9 + 6));
  auVar92._4_4_ = auVar13._4_4_ * auVar88._4_4_;
  auVar92._0_4_ = auVar13._0_4_ * auVar88._0_4_;
  auVar92._8_4_ = auVar13._8_4_ * auVar88._8_4_;
  auVar92._12_4_ = auVar13._12_4_ * auVar88._12_4_;
  auVar92._16_4_ = auVar88._16_4_ * 0.0;
  auVar92._20_4_ = auVar88._20_4_ * 0.0;
  auVar92._24_4_ = auVar88._24_4_ * 0.0;
  auVar92._28_4_ = auVar88._28_4_;
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx512vl(auVar87,auVar86);
  auVar99._0_4_ = auVar13._0_4_ * auVar87._0_4_;
  auVar99._4_4_ = auVar13._4_4_ * auVar87._4_4_;
  auVar99._8_4_ = auVar13._8_4_ * auVar87._8_4_;
  auVar99._12_4_ = auVar13._12_4_ * auVar87._12_4_;
  auVar99._16_4_ = auVar87._16_4_ * 0.0;
  auVar99._20_4_ = auVar87._20_4_ * 0.0;
  auVar99._24_4_ = auVar87._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar2 * 0x10 + uVar56 * -2 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar76));
  auVar93._4_4_ = auVar14._4_4_ * auVar87._4_4_;
  auVar93._0_4_ = auVar14._0_4_ * auVar87._0_4_;
  auVar93._8_4_ = auVar14._8_4_ * auVar87._8_4_;
  auVar93._12_4_ = auVar14._12_4_ * auVar87._12_4_;
  auVar93._16_4_ = auVar87._16_4_ * 0.0;
  auVar93._20_4_ = auVar87._20_4_ * 0.0;
  auVar93._24_4_ = auVar87._24_4_ * 0.0;
  auVar93._28_4_ = auVar87._28_4_;
  auVar87 = vcvtdq2ps_avx(auVar86);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar76));
  auVar97._0_4_ = auVar14._0_4_ * auVar87._0_4_;
  auVar97._4_4_ = auVar14._4_4_ * auVar87._4_4_;
  auVar97._8_4_ = auVar14._8_4_ * auVar87._8_4_;
  auVar97._12_4_ = auVar14._12_4_ * auVar87._12_4_;
  auVar97._16_4_ = auVar87._16_4_ * 0.0;
  auVar97._20_4_ = auVar87._20_4_ * 0.0;
  auVar97._24_4_ = auVar87._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 + uVar56 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar77));
  auVar94._4_4_ = auVar87._4_4_ * auVar74._4_4_;
  auVar94._0_4_ = auVar87._0_4_ * auVar74._0_4_;
  auVar94._8_4_ = auVar87._8_4_ * auVar74._8_4_;
  auVar94._12_4_ = auVar87._12_4_ * auVar74._12_4_;
  auVar94._16_4_ = auVar87._16_4_ * 0.0;
  auVar94._20_4_ = auVar87._20_4_ * 0.0;
  auVar94._24_4_ = auVar87._24_4_ * 0.0;
  auVar94._28_4_ = auVar87._28_4_;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 0x17 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar77));
  auVar83._0_4_ = auVar74._0_4_ * auVar87._0_4_;
  auVar83._4_4_ = auVar74._4_4_ * auVar87._4_4_;
  auVar83._8_4_ = auVar74._8_4_ * auVar87._8_4_;
  auVar83._12_4_ = auVar74._12_4_ * auVar87._12_4_;
  auVar83._16_4_ = auVar87._16_4_ * 0.0;
  auVar83._20_4_ = auVar87._20_4_ * 0.0;
  auVar83._24_4_ = auVar87._24_4_ * 0.0;
  auVar83._28_4_ = 0;
  auVar87 = vpminsd_avx2(auVar92,auVar99);
  auVar86 = vpminsd_avx2(auVar93,auVar97);
  auVar87 = vmaxps_avx(auVar87,auVar86);
  auVar86 = vpminsd_avx2(auVar94,auVar83);
  uVar205 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar88._4_4_ = uVar205;
  auVar88._0_4_ = uVar205;
  auVar88._8_4_ = uVar205;
  auVar88._12_4_ = uVar205;
  auVar88._16_4_ = uVar205;
  auVar88._20_4_ = uVar205;
  auVar88._24_4_ = uVar205;
  auVar88._28_4_ = uVar205;
  auVar86 = vmaxps_avx512vl(auVar86,auVar88);
  auVar87 = vmaxps_avx(auVar87,auVar86);
  auVar86._8_4_ = 0x3f7ffffa;
  auVar86._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar86._12_4_ = 0x3f7ffffa;
  auVar86._16_4_ = 0x3f7ffffa;
  auVar86._20_4_ = 0x3f7ffffa;
  auVar86._24_4_ = 0x3f7ffffa;
  auVar86._28_4_ = 0x3f7ffffa;
  local_220 = vmulps_avx512vl(auVar87,auVar86);
  auVar87 = vpmaxsd_avx2(auVar92,auVar99);
  auVar86 = vpmaxsd_avx2(auVar93,auVar97);
  auVar87 = vminps_avx(auVar87,auVar86);
  auVar86 = vpmaxsd_avx2(auVar94,auVar83);
  uVar205 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar89._4_4_ = uVar205;
  auVar89._0_4_ = uVar205;
  auVar89._8_4_ = uVar205;
  auVar89._12_4_ = uVar205;
  auVar89._16_4_ = uVar205;
  auVar89._20_4_ = uVar205;
  auVar89._24_4_ = uVar205;
  auVar89._28_4_ = uVar205;
  auVar86 = vminps_avx512vl(auVar86,auVar89);
  auVar87 = vminps_avx(auVar87,auVar86);
  auVar90._8_4_ = 0x3f800003;
  auVar90._0_8_ = 0x3f8000033f800003;
  auVar90._12_4_ = 0x3f800003;
  auVar90._16_4_ = 0x3f800003;
  auVar90._20_4_ = 0x3f800003;
  auVar90._24_4_ = 0x3f800003;
  auVar90._28_4_ = 0x3f800003;
  auVar87 = vmulps_avx512vl(auVar87,auVar90);
  auVar86 = vpbroadcastd_avx512vl();
  uVar18 = vpcmpgtd_avx512vl(auVar86,_DAT_0205a920);
  uVar16 = vcmpps_avx512vl(local_220,auVar87,2);
  bVar70 = (byte)((byte)uVar16 & (byte)uVar18) == 0;
  bVar72 = !bVar70;
  if (bVar70) {
    return bVar72;
  }
  uVar59 = (ulong)(byte)((byte)uVar16 & (byte)uVar18);
  local_440 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
LAB_01d7ba7b:
  lVar68 = 0;
  for (uVar56 = uVar59; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    lVar68 = lVar68 + 1;
  }
  uVar67 = *(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[uVar67].ptr;
  lVar4 = *(long *)&pGVar3[1].time_range.upper;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(prim + lVar68 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar13 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * uVar56);
  auVar14 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * (uVar56 + 1));
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar76 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar205 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar242._4_4_ = uVar205;
  auVar242._0_4_ = uVar205;
  auVar242._8_4_ = uVar205;
  auVar242._12_4_ = uVar205;
  local_520._16_4_ = uVar205;
  local_520._0_16_ = auVar242;
  local_520._20_4_ = uVar205;
  local_520._24_4_ = uVar205;
  local_520._28_4_ = uVar205;
  auVar86 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar74 = vunpcklps_avx512vl(auVar242,auVar86._0_16_);
  fVar64 = *(float *)(ray + k * 4 + 0xc0);
  auVar249._4_4_ = fVar64;
  auVar249._0_4_ = fVar64;
  auVar249._8_4_ = fVar64;
  auVar249._12_4_ = fVar64;
  local_500._16_4_ = fVar64;
  local_500._0_16_ = auVar249;
  local_500._20_4_ = fVar64;
  local_500._24_4_ = fVar64;
  local_500._28_4_ = fVar64;
  local_6f0 = vinsertps_avx(auVar74,auVar249,0x28);
  auVar81._8_4_ = 0xbeaaaaab;
  auVar81._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar81._12_4_ = 0xbeaaaaab;
  auVar78 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar3[2].intersectionFilterN +
                              uVar56 * (long)pGVar3[2].pointQueryFunc),auVar13,auVar81);
  auVar77 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar3[2].intersectionFilterN +
                             (long)pGVar3[2].pointQueryFunc * (uVar56 + 1)),auVar14,auVar81);
  auVar221._0_4_ = auVar14._0_4_ + auVar13._0_4_ + auVar78._0_4_ + auVar77._0_4_;
  auVar221._4_4_ = auVar14._4_4_ + auVar13._4_4_ + auVar78._4_4_ + auVar77._4_4_;
  auVar221._8_4_ = auVar14._8_4_ + auVar13._8_4_ + auVar78._8_4_ + auVar77._8_4_;
  auVar221._12_4_ = auVar14._12_4_ + auVar13._12_4_ + auVar78._12_4_ + auVar77._12_4_;
  auVar80._8_4_ = 0x3e800000;
  auVar80._0_8_ = 0x3e8000003e800000;
  auVar80._12_4_ = 0x3e800000;
  auVar74 = vmulps_avx512vl(auVar221,auVar80);
  auVar74 = vsubps_avx(auVar74,auVar76);
  auVar74 = vdpps_avx(auVar74,local_6f0,0x7f);
  fVar145 = *(float *)(ray + k * 4 + 0x60);
  local_700 = vdpps_avx(local_6f0,local_6f0,0x7f);
  local_400 = vpbroadcastd_avx512vl();
  auVar226._4_12_ = ZEXT812(0) << 0x20;
  auVar226._0_4_ = local_700._0_4_;
  auVar75 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar226);
  auVar1 = vfnmadd213ss_fma(auVar75,local_700,ZEXT416(0x40000000));
  local_200 = auVar74._0_4_ * auVar75._0_4_ * auVar1._0_4_;
  auVar227._4_4_ = local_200;
  auVar227._0_4_ = local_200;
  auVar227._8_4_ = local_200;
  auVar227._12_4_ = local_200;
  fStack_4d0 = local_200;
  _local_4e0 = auVar227;
  fStack_4cc = local_200;
  fStack_4c8 = local_200;
  fStack_4c4 = local_200;
  auVar74 = vfmadd231ps_fma(auVar76,local_6f0,auVar227);
  auVar74 = vblendps_avx(auVar74,ZEXT816(0) << 0x40,8);
  auVar13 = vsubps_avx(auVar13,auVar74);
  auVar76 = vsubps_avx(auVar77,auVar74);
  auVar77 = vsubps_avx(auVar78,auVar74);
  auVar14 = vsubps_avx(auVar14,auVar74);
  uVar205 = auVar13._0_4_;
  local_6e0._4_4_ = uVar205;
  local_6e0._0_4_ = uVar205;
  local_6e0._8_4_ = uVar205;
  local_6e0._12_4_ = uVar205;
  local_6e0._16_4_ = uVar205;
  local_6e0._20_4_ = uVar205;
  local_6e0._24_4_ = uVar205;
  local_6e0._28_4_ = uVar205;
  auVar238 = ZEXT3264(local_6e0);
  auVar105._8_4_ = 1;
  auVar105._0_8_ = 0x100000001;
  auVar105._12_4_ = 1;
  auVar105._16_4_ = 1;
  auVar105._20_4_ = 1;
  auVar105._24_4_ = 1;
  auVar105._28_4_ = 1;
  local_580 = ZEXT1632(auVar13);
  auVar87 = vpermps_avx2(auVar105,local_580);
  auVar106._8_4_ = 2;
  auVar106._0_8_ = 0x200000002;
  auVar106._12_4_ = 2;
  auVar106._16_4_ = 2;
  auVar106._20_4_ = 2;
  auVar106._24_4_ = 2;
  auVar106._28_4_ = 2;
  auVar88 = vpermps_avx512vl(auVar106,local_580);
  auVar107._8_4_ = 3;
  auVar107._0_8_ = 0x300000003;
  auVar107._12_4_ = 3;
  auVar107._16_4_ = 3;
  auVar107._20_4_ = 3;
  auVar107._24_4_ = 3;
  auVar107._28_4_ = 3;
  auVar89 = vpermps_avx512vl(auVar107,local_580);
  uVar205 = auVar77._0_4_;
  local_600._4_4_ = uVar205;
  local_600._0_4_ = uVar205;
  local_600._8_4_ = uVar205;
  local_600._12_4_ = uVar205;
  local_600._16_4_ = uVar205;
  local_600._20_4_ = uVar205;
  local_600._24_4_ = uVar205;
  local_600._28_4_ = uVar205;
  local_5c0 = ZEXT1632(auVar77);
  local_740 = vpermps_avx2(auVar105,local_5c0);
  auVar90 = vpermps_avx512vl(auVar106,local_5c0);
  auVar91 = vpermps_avx512vl(auVar107,local_5c0);
  auVar92 = vbroadcastss_avx512vl(auVar76);
  local_5a0 = ZEXT1632(auVar76);
  auVar93 = vpermps_avx512vl(auVar105,local_5a0);
  auVar94 = vpermps_avx512vl(auVar106,local_5a0);
  auVar95 = vpermps_avx512vl(auVar107,local_5a0);
  auVar220 = ZEXT3264(local_740);
  auVar84 = vbroadcastss_avx512vl(auVar14);
  _local_5e0 = ZEXT1632(auVar14);
  auVar85 = vpermps_avx512vl(auVar105,_local_5e0);
  auVar96 = vpermps_avx512vl(auVar106,_local_5e0);
  auVar82 = vpermps_avx512vl(auVar107,_local_5e0);
  auVar203 = ZEXT3264(local_600);
  local_3c0 = vfmadd231ps_avx512vl(ZEXT432((uint)(fVar64 * fVar64)),auVar86,auVar86);
  auVar13 = vfmadd231ps_fma(local_3c0,local_520,local_520);
  local_1e0._0_4_ = auVar13._0_4_;
  local_1e0._4_4_ = local_1e0._0_4_;
  local_1e0._8_4_ = local_1e0._0_4_;
  local_1e0._12_4_ = local_1e0._0_4_;
  local_1e0._16_4_ = local_1e0._0_4_;
  local_1e0._20_4_ = local_1e0._0_4_;
  local_1e0._24_4_ = local_1e0._0_4_;
  local_1e0._28_4_ = local_1e0._0_4_;
  vandps_avx512vl(local_1e0,auVar250._0_32_);
  local_660 = ZEXT416((uint)local_200);
  local_200 = fVar145 - local_200;
  fStack_1fc = local_200;
  fStack_1f8 = local_200;
  fStack_1f4 = local_200;
  fStack_1f0 = local_200;
  fStack_1ec = local_200;
  fStack_1e8 = local_200;
  fStack_1e4 = local_200;
  uVar56 = 0;
  bVar65 = 0;
  fVar64 = 1.4013e-45;
  local_420 = vpbroadcastd_avx512vl();
  auVar13 = vsqrtss_avx(local_700,local_700);
  auVar14 = vsqrtss_avx(local_700,local_700);
  local_680 = ZEXT816(0x3f80000000000000);
  auVar213 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar74 = vmovshdup_avx(local_680);
    auVar224._0_4_ = local_680._0_4_;
    fVar225 = auVar74._0_4_ - auVar224._0_4_;
    fVar240 = fVar225 * 0.04761905;
    auVar224._4_4_ = auVar224._0_4_;
    auVar224._8_4_ = auVar224._0_4_;
    auVar224._12_4_ = auVar224._0_4_;
    auVar224._16_4_ = auVar224._0_4_;
    auVar224._20_4_ = auVar224._0_4_;
    auVar224._24_4_ = auVar224._0_4_;
    auVar224._28_4_ = auVar224._0_4_;
    local_720._4_4_ = fVar225;
    local_720._0_4_ = fVar225;
    local_720._8_4_ = fVar225;
    local_720._12_4_ = fVar225;
    local_720._16_4_ = fVar225;
    local_720._20_4_ = fVar225;
    local_720._24_4_ = fVar225;
    local_720._28_4_ = fVar225;
    auVar74 = vfmadd231ps_fma(auVar224,local_720,_DAT_02020f20);
    auVar124 = auVar213._0_32_;
    auVar83 = vsubps_avx(auVar124,ZEXT1632(auVar74));
    fVar225 = auVar74._0_4_;
    auVar122._0_4_ = auVar203._0_4_ * fVar225;
    fVar232 = auVar74._4_4_;
    auVar122._4_4_ = auVar203._4_4_ * fVar232;
    fVar233 = auVar74._8_4_;
    auVar122._8_4_ = auVar203._8_4_ * fVar233;
    fVar234 = auVar74._12_4_;
    auVar122._12_4_ = auVar203._12_4_ * fVar234;
    auVar122._16_4_ = auVar203._16_4_ * 0.0;
    auVar122._20_4_ = auVar203._20_4_ * 0.0;
    auVar122._24_4_ = auVar203._24_4_ * 0.0;
    auVar122._28_4_ = 0;
    auVar99 = ZEXT1632(auVar74);
    auVar250._0_4_ = auVar220._0_4_ * fVar225;
    auVar250._4_4_ = auVar220._4_4_ * fVar232;
    auVar250._8_4_ = auVar220._8_4_ * fVar233;
    auVar250._12_4_ = auVar220._12_4_ * fVar234;
    auVar250._16_4_ = auVar220._16_4_ * 0.0;
    auVar250._20_4_ = auVar220._20_4_ * 0.0;
    auVar250._28_36_ = auVar203._28_36_;
    auVar250._24_4_ = auVar220._24_4_ * 0.0;
    auVar97 = vmulps_avx512vl(auVar90,auVar99);
    auVar98 = vmulps_avx512vl(auVar91,auVar99);
    auVar76 = vfmadd231ps_fma(auVar122,auVar83,auVar238._0_32_);
    auVar77 = vfmadd231ps_fma(auVar250._0_32_,auVar83,auVar87);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar83,auVar88);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar83,auVar89);
    auVar99 = vmulps_avx512vl(auVar92,auVar99);
    auVar105 = ZEXT1632(auVar74);
    auVar100 = vmulps_avx512vl(auVar93,auVar105);
    auVar101 = vmulps_avx512vl(auVar94,auVar105);
    auVar102 = vmulps_avx512vl(auVar95,auVar105);
    auVar78 = vfmadd231ps_fma(auVar99,auVar83,auVar203._0_32_);
    auVar1 = vfmadd231ps_fma(auVar100,auVar83,auVar220._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar101,auVar83,auVar90);
    auVar100 = vfmadd231ps_avx512vl(auVar102,auVar83,auVar91);
    auVar101 = vmulps_avx512vl(auVar84,auVar105);
    auVar102 = vmulps_avx512vl(auVar85,auVar105);
    auVar103 = vmulps_avx512vl(auVar96,auVar105);
    auVar104 = vmulps_avx512vl(auVar82,auVar105);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar83,auVar92);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar83,auVar93);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar83,auVar94);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar83,auVar95);
    auVar105 = vmulps_avx512vl(auVar105,ZEXT1632(auVar78));
    auVar111 = ZEXT1632(auVar74);
    auVar106 = vmulps_avx512vl(auVar111,ZEXT1632(auVar1));
    auVar107 = vmulps_avx512vl(auVar111,auVar99);
    auVar108 = vmulps_avx512vl(auVar111,auVar100);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar83,ZEXT1632(auVar76));
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar83,ZEXT1632(auVar77));
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar83,auVar97);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar83,auVar98);
    auVar127._0_4_ = auVar101._0_4_ * fVar225;
    auVar127._4_4_ = auVar101._4_4_ * fVar232;
    auVar127._8_4_ = auVar101._8_4_ * fVar233;
    auVar127._12_4_ = auVar101._12_4_ * fVar234;
    auVar127._16_4_ = auVar101._16_4_ * 0.0;
    auVar127._20_4_ = auVar101._20_4_ * 0.0;
    auVar127._24_4_ = auVar101._24_4_ * 0.0;
    auVar127._28_4_ = 0;
    auVar109._4_4_ = auVar102._4_4_ * fVar232;
    auVar109._0_4_ = auVar102._0_4_ * fVar225;
    auVar109._8_4_ = auVar102._8_4_ * fVar233;
    auVar109._12_4_ = auVar102._12_4_ * fVar234;
    auVar109._16_4_ = auVar102._16_4_ * 0.0;
    auVar109._20_4_ = auVar102._20_4_ * 0.0;
    auVar109._24_4_ = auVar102._24_4_ * 0.0;
    auVar109._28_4_ = auVar101._28_4_;
    auVar110._4_4_ = auVar103._4_4_ * fVar232;
    auVar110._0_4_ = auVar103._0_4_ * fVar225;
    auVar110._8_4_ = auVar103._8_4_ * fVar233;
    auVar110._12_4_ = auVar103._12_4_ * fVar234;
    auVar110._16_4_ = auVar103._16_4_ * 0.0;
    auVar110._20_4_ = auVar103._20_4_ * 0.0;
    auVar110._24_4_ = auVar103._24_4_ * 0.0;
    auVar110._28_4_ = auVar102._28_4_;
    auVar115._4_4_ = auVar104._4_4_ * fVar232;
    auVar115._0_4_ = auVar104._0_4_ * fVar225;
    auVar115._8_4_ = auVar104._8_4_ * fVar233;
    auVar115._12_4_ = auVar104._12_4_ * fVar234;
    auVar115._16_4_ = auVar104._16_4_ * 0.0;
    auVar115._20_4_ = auVar104._20_4_ * 0.0;
    auVar115._24_4_ = auVar104._24_4_ * 0.0;
    auVar115._28_4_ = auVar103._28_4_;
    auVar74 = vfmadd231ps_fma(auVar127,auVar83,ZEXT1632(auVar78));
    auVar76 = vfmadd231ps_fma(auVar109,auVar83,ZEXT1632(auVar1));
    auVar77 = vfmadd231ps_fma(auVar110,auVar83,auVar99);
    auVar78 = vfmadd231ps_fma(auVar115,auVar83,auVar100);
    auVar116._28_4_ = auVar98._28_4_;
    auVar116._0_28_ =
         ZEXT1628(CONCAT412(fVar234 * auVar74._12_4_,
                            CONCAT48(fVar233 * auVar74._8_4_,
                                     CONCAT44(fVar232 * auVar74._4_4_,fVar225 * auVar74._0_4_))));
    auVar117._28_4_ = auVar97._28_4_;
    auVar117._0_28_ =
         ZEXT1628(CONCAT412(auVar76._12_4_ * fVar234,
                            CONCAT48(auVar76._8_4_ * fVar233,
                                     CONCAT44(auVar76._4_4_ * fVar232,auVar76._0_4_ * fVar225))));
    auVar97 = vmulps_avx512vl(auVar111,ZEXT1632(auVar77));
    auVar101 = vfmadd231ps_avx512vl(auVar116,auVar83,auVar105);
    auVar102 = vfmadd231ps_avx512vl(auVar117,auVar83,auVar106);
    local_6c0 = vfmadd231ps_avx512vl(auVar97,auVar83,auVar107);
    auVar98 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar78._12_4_ * fVar234,
                                            CONCAT48(auVar78._8_4_ * fVar233,
                                                     CONCAT44(auVar78._4_4_ * fVar232,
                                                              auVar78._0_4_ * fVar225)))),auVar108,
                         auVar83);
    auVar83 = vsubps_avx512vl(ZEXT1632(auVar74),auVar105);
    auVar97 = vsubps_avx512vl(ZEXT1632(auVar76),auVar106);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar77),auVar107);
    auVar103 = vsubps_avx512vl(ZEXT1632(auVar78),auVar108);
    auVar125._4_4_ = fVar240 * auVar83._4_4_ * 3.0;
    auVar125._0_4_ = fVar240 * auVar83._0_4_ * 3.0;
    auVar125._8_4_ = fVar240 * auVar83._8_4_ * 3.0;
    auVar125._12_4_ = fVar240 * auVar83._12_4_ * 3.0;
    auVar125._16_4_ = fVar240 * auVar83._16_4_ * 3.0;
    auVar125._20_4_ = fVar240 * auVar83._20_4_ * 3.0;
    auVar125._24_4_ = fVar240 * auVar83._24_4_ * 3.0;
    auVar125._28_4_ = auVar100._28_4_;
    auVar243._0_4_ = fVar240 * auVar97._0_4_ * 3.0;
    auVar243._4_4_ = fVar240 * auVar97._4_4_ * 3.0;
    auVar243._8_4_ = fVar240 * auVar97._8_4_ * 3.0;
    auVar243._12_4_ = fVar240 * auVar97._12_4_ * 3.0;
    auVar243._16_4_ = fVar240 * auVar97._16_4_ * 3.0;
    auVar243._20_4_ = fVar240 * auVar97._20_4_ * 3.0;
    auVar243._24_4_ = fVar240 * auVar97._24_4_ * 3.0;
    auVar243._28_4_ = 0;
    auVar247._0_4_ = auVar99._0_4_ * 3.0 * fVar240;
    auVar247._4_4_ = auVar99._4_4_ * 3.0 * fVar240;
    auVar247._8_4_ = auVar99._8_4_ * 3.0 * fVar240;
    auVar247._12_4_ = auVar99._12_4_ * 3.0 * fVar240;
    auVar247._16_4_ = auVar99._16_4_ * 3.0 * fVar240;
    auVar247._20_4_ = auVar99._20_4_ * 3.0 * fVar240;
    auVar247._24_4_ = auVar99._24_4_ * 3.0 * fVar240;
    auVar247._28_4_ = 0;
    fVar225 = auVar103._0_4_ * 3.0 * fVar240;
    fVar232 = auVar103._4_4_ * 3.0 * fVar240;
    auVar118._4_4_ = fVar232;
    auVar118._0_4_ = fVar225;
    fVar233 = auVar103._8_4_ * 3.0 * fVar240;
    auVar118._8_4_ = fVar233;
    fVar234 = auVar103._12_4_ * 3.0 * fVar240;
    auVar118._12_4_ = fVar234;
    fVar235 = auVar103._16_4_ * 3.0 * fVar240;
    auVar118._16_4_ = fVar235;
    fVar204 = auVar103._20_4_ * 3.0 * fVar240;
    auVar118._20_4_ = fVar204;
    fVar236 = auVar103._24_4_ * 3.0 * fVar240;
    auVar118._24_4_ = fVar236;
    auVar118._28_4_ = fVar240;
    auVar74 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar100 = vpermt2ps_avx512vl(auVar101,_DAT_0205fd20,ZEXT1632(auVar74));
    auVar103 = vpermt2ps_avx512vl(auVar102,_DAT_0205fd20,ZEXT1632(auVar74));
    auVar99 = ZEXT1632(auVar74);
    auVar104 = vpermt2ps_avx512vl(local_6c0,_DAT_0205fd20,auVar99);
    auVar128._0_4_ = auVar98._0_4_ + fVar225;
    auVar128._4_4_ = auVar98._4_4_ + fVar232;
    auVar128._8_4_ = auVar98._8_4_ + fVar233;
    auVar128._12_4_ = auVar98._12_4_ + fVar234;
    auVar128._16_4_ = auVar98._16_4_ + fVar235;
    auVar128._20_4_ = auVar98._20_4_ + fVar204;
    auVar128._24_4_ = auVar98._24_4_ + fVar236;
    auVar128._28_4_ = auVar98._28_4_ + fVar240;
    auVar83 = vmaxps_avx(auVar98,auVar128);
    auVar97 = vminps_avx(auVar98,auVar128);
    auVar105 = vpermt2ps_avx512vl(auVar98,_DAT_0205fd20,auVar99);
    auVar106 = vpermt2ps_avx512vl(auVar125,_DAT_0205fd20,auVar99);
    auVar107 = vpermt2ps_avx512vl(auVar243,_DAT_0205fd20,auVar99);
    auVar122 = ZEXT1632(auVar74);
    auVar109 = vpermt2ps_avx512vl(auVar247,_DAT_0205fd20,auVar122);
    auVar98 = vpermt2ps_avx512vl(auVar118,_DAT_0205fd20,auVar122);
    auVar108 = vsubps_avx512vl(auVar105,auVar98);
    auVar98 = vsubps_avx(auVar100,auVar101);
    auVar99 = vsubps_avx(auVar103,auVar102);
    auVar110 = vsubps_avx512vl(auVar104,local_6c0);
    auVar111 = vmulps_avx512vl(auVar99,auVar247);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar243,auVar110);
    auVar112 = vmulps_avx512vl(auVar110,auVar125);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar247,auVar98);
    auVar113 = vmulps_avx512vl(auVar98,auVar243);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar125,auVar99);
    auVar113 = vmulps_avx512vl(auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar112 = vmulps_avx512vl(auVar110,auVar110);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar99,auVar99);
    auVar113 = vfmadd231ps_avx512vl(auVar112,auVar98,auVar98);
    auVar112 = vrcp14ps_avx512vl(auVar113);
    auVar114 = vfnmadd213ps_avx512vl(auVar112,auVar113,auVar124);
    auVar112 = vfmadd132ps_avx512vl(auVar114,auVar112,auVar112);
    auVar111 = vmulps_avx512vl(auVar111,auVar112);
    auVar114 = vmulps_avx512vl(auVar99,auVar109);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar107,auVar110);
    auVar115 = vmulps_avx512vl(auVar110,auVar106);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar109,auVar98);
    auVar116 = vmulps_avx512vl(auVar98,auVar107);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar106,auVar99);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar112 = vmulps_avx512vl(auVar114,auVar112);
    auVar111 = vmaxps_avx512vl(auVar111,auVar112);
    auVar111 = vsqrtps_avx512vl(auVar111);
    auVar112 = vmaxps_avx512vl(auVar108,auVar105);
    auVar83 = vmaxps_avx512vl(auVar83,auVar112);
    auVar112 = vaddps_avx512vl(auVar111,auVar83);
    auVar83 = vminps_avx512vl(auVar108,auVar105);
    auVar83 = vminps_avx(auVar97,auVar83);
    auVar83 = vsubps_avx512vl(auVar83,auVar111);
    auVar108._8_4_ = 0x3f800002;
    auVar108._0_8_ = 0x3f8000023f800002;
    auVar108._12_4_ = 0x3f800002;
    auVar108._16_4_ = 0x3f800002;
    auVar108._20_4_ = 0x3f800002;
    auVar108._24_4_ = 0x3f800002;
    auVar108._28_4_ = 0x3f800002;
    auVar97 = vmulps_avx512vl(auVar112,auVar108);
    auVar111._8_4_ = 0x3f7ffffc;
    auVar111._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar111._12_4_ = 0x3f7ffffc;
    auVar111._16_4_ = 0x3f7ffffc;
    auVar111._20_4_ = 0x3f7ffffc;
    auVar111._24_4_ = 0x3f7ffffc;
    auVar111._28_4_ = 0x3f7ffffc;
    auVar83 = vmulps_avx512vl(auVar83,auVar111);
    auVar119._4_4_ = auVar97._4_4_ * auVar97._4_4_;
    auVar119._0_4_ = auVar97._0_4_ * auVar97._0_4_;
    auVar119._8_4_ = auVar97._8_4_ * auVar97._8_4_;
    auVar119._12_4_ = auVar97._12_4_ * auVar97._12_4_;
    auVar119._16_4_ = auVar97._16_4_ * auVar97._16_4_;
    auVar119._20_4_ = auVar97._20_4_ * auVar97._20_4_;
    auVar119._24_4_ = auVar97._24_4_ * auVar97._24_4_;
    auVar119._28_4_ = auVar83._28_4_;
    auVar97 = vrsqrt14ps_avx512vl(auVar113);
    auVar112._8_4_ = 0xbf000000;
    auVar112._0_8_ = 0xbf000000bf000000;
    auVar112._12_4_ = 0xbf000000;
    auVar112._16_4_ = 0xbf000000;
    auVar112._20_4_ = 0xbf000000;
    auVar112._24_4_ = 0xbf000000;
    auVar112._28_4_ = 0xbf000000;
    auVar105 = vmulps_avx512vl(auVar113,auVar112);
    auVar120._4_4_ = auVar97._4_4_ * auVar105._4_4_;
    auVar120._0_4_ = auVar97._0_4_ * auVar105._0_4_;
    auVar120._8_4_ = auVar97._8_4_ * auVar105._8_4_;
    auVar120._12_4_ = auVar97._12_4_ * auVar105._12_4_;
    auVar120._16_4_ = auVar97._16_4_ * auVar105._16_4_;
    auVar120._20_4_ = auVar97._20_4_ * auVar105._20_4_;
    auVar120._24_4_ = auVar97._24_4_ * auVar105._24_4_;
    auVar120._28_4_ = auVar105._28_4_;
    auVar105 = vmulps_avx512vl(auVar97,auVar97);
    auVar105 = vmulps_avx512vl(auVar105,auVar120);
    auVar113._8_4_ = 0x3fc00000;
    auVar113._0_8_ = 0x3fc000003fc00000;
    auVar113._12_4_ = 0x3fc00000;
    auVar113._16_4_ = 0x3fc00000;
    auVar113._20_4_ = 0x3fc00000;
    auVar113._24_4_ = 0x3fc00000;
    auVar113._28_4_ = 0x3fc00000;
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar97,auVar113);
    auVar121._4_4_ = auVar105._4_4_ * auVar98._4_4_;
    auVar121._0_4_ = auVar105._0_4_ * auVar98._0_4_;
    auVar121._8_4_ = auVar105._8_4_ * auVar98._8_4_;
    auVar121._12_4_ = auVar105._12_4_ * auVar98._12_4_;
    auVar121._16_4_ = auVar105._16_4_ * auVar98._16_4_;
    auVar121._20_4_ = auVar105._20_4_ * auVar98._20_4_;
    auVar121._24_4_ = auVar105._24_4_ * auVar98._24_4_;
    auVar121._28_4_ = auVar97._28_4_;
    auVar97 = vmulps_avx512vl(auVar99,auVar105);
    auVar108 = vmulps_avx512vl(auVar110,auVar105);
    auVar111 = vsubps_avx512vl(auVar122,auVar101);
    auVar112 = vsubps_avx512vl(auVar122,auVar102);
    auVar113 = vsubps_avx512vl(auVar122,local_6c0);
    auVar114 = vmulps_avx512vl(local_500,auVar113);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar86,auVar112);
    auVar114 = vfmadd231ps_avx512vl(auVar114,local_520,auVar111);
    auVar115 = vmulps_avx512vl(auVar113,auVar113);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar112,auVar112);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar111,auVar111);
    auVar116 = vmulps_avx512vl(local_500,auVar108);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar97,auVar86);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar121,local_520);
    auVar108 = vmulps_avx512vl(auVar113,auVar108);
    auVar97 = vfmadd231ps_avx512vl(auVar108,auVar112,auVar97);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar111,auVar121);
    local_540 = vmulps_avx512vl(auVar116,auVar116);
    auVar108 = vsubps_avx512vl(local_1e0,local_540);
    auVar117 = vmulps_avx512vl(auVar116,auVar97);
    auVar114 = vsubps_avx512vl(auVar114,auVar117);
    auVar117 = vaddps_avx512vl(auVar114,auVar114);
    auVar114 = vmulps_avx512vl(auVar97,auVar97);
    auVar115 = vsubps_avx512vl(auVar115,auVar114);
    auVar118 = vsubps_avx512vl(auVar115,auVar119);
    auVar119 = vmulps_avx512vl(auVar117,auVar117);
    auVar114._8_4_ = 0x40800000;
    auVar114._0_8_ = 0x4080000040800000;
    auVar114._12_4_ = 0x40800000;
    auVar114._16_4_ = 0x40800000;
    auVar114._20_4_ = 0x40800000;
    auVar114._24_4_ = 0x40800000;
    auVar114._28_4_ = 0x40800000;
    auVar114 = vmulps_avx512vl(auVar108,auVar114);
    auVar120 = vmulps_avx512vl(auVar114,auVar118);
    auVar120 = vsubps_avx512vl(auVar119,auVar120);
    uVar73 = vcmpps_avx512vl(auVar120,auVar122,5);
    bVar58 = (byte)uVar73;
    if (bVar58 == 0) {
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar120 = vsqrtps_avx512vl(auVar120);
      auVar121 = vaddps_avx512vl(auVar108,auVar108);
      auVar122 = vrcp14ps_avx512vl(auVar121);
      auVar121 = vfnmadd213ps_avx512vl(auVar121,auVar122,auVar124);
      auVar121 = vfmadd132ps_avx512vl(auVar121,auVar122,auVar122);
      auVar26._8_4_ = 0x80000000;
      auVar26._0_8_ = 0x8000000080000000;
      auVar26._12_4_ = 0x80000000;
      auVar26._16_4_ = 0x80000000;
      auVar26._20_4_ = 0x80000000;
      auVar26._24_4_ = 0x80000000;
      auVar26._28_4_ = 0x80000000;
      auVar122 = vxorps_avx512vl(auVar117,auVar26);
      auVar122 = vsubps_avx512vl(auVar122,auVar120);
      auVar122 = vmulps_avx512vl(auVar122,auVar121);
      auVar120 = vsubps_avx512vl(auVar120,auVar117);
      auVar120 = vmulps_avx512vl(auVar120,auVar121);
      auVar121 = vfmadd213ps_avx512vl(auVar116,auVar122,auVar97);
      local_460 = vmulps_avx512vl(auVar105,auVar121);
      auVar121 = vfmadd213ps_avx512vl(auVar116,auVar120,auVar97);
      local_480 = vmulps_avx512vl(auVar105,auVar121);
      auVar152._8_4_ = 0x7f800000;
      auVar152._0_8_ = 0x7f8000007f800000;
      auVar152._12_4_ = 0x7f800000;
      auVar152._16_4_ = 0x7f800000;
      auVar152._20_4_ = 0x7f800000;
      auVar152._24_4_ = 0x7f800000;
      auVar152._28_4_ = 0x7f800000;
      auVar121 = vblendmps_avx512vl(auVar152,auVar122);
      auVar124._0_4_ =
           (uint)(bVar58 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar58 & 1) * local_480._0_4_;
      bVar70 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar70 * auVar121._4_4_ | (uint)!bVar70 * local_480._4_4_;
      bVar70 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar70 * auVar121._8_4_ | (uint)!bVar70 * local_480._8_4_;
      bVar70 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar70 * auVar121._12_4_ | (uint)!bVar70 * local_480._12_4_;
      bVar70 = (bool)((byte)(uVar73 >> 4) & 1);
      auVar124._16_4_ = (uint)bVar70 * auVar121._16_4_ | (uint)!bVar70 * local_480._16_4_;
      bVar70 = (bool)((byte)(uVar73 >> 5) & 1);
      auVar124._20_4_ = (uint)bVar70 * auVar121._20_4_ | (uint)!bVar70 * local_480._20_4_;
      bVar70 = (bool)((byte)(uVar73 >> 6) & 1);
      auVar124._24_4_ = (uint)bVar70 * auVar121._24_4_ | (uint)!bVar70 * local_480._24_4_;
      bVar70 = SUB81(uVar73 >> 7,0);
      auVar124._28_4_ = (uint)bVar70 * auVar121._28_4_ | (uint)!bVar70 * local_480._28_4_;
      auVar153._8_4_ = 0xff800000;
      auVar153._0_8_ = 0xff800000ff800000;
      auVar153._12_4_ = 0xff800000;
      auVar153._16_4_ = 0xff800000;
      auVar153._20_4_ = 0xff800000;
      auVar153._24_4_ = 0xff800000;
      auVar153._28_4_ = 0xff800000;
      auVar121 = vblendmps_avx512vl(auVar153,auVar120);
      auVar123._0_4_ =
           (uint)(bVar58 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar120._0_4_;
      bVar70 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar70 * auVar121._4_4_ | (uint)!bVar70 * auVar120._4_4_;
      bVar70 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar70 * auVar121._8_4_ | (uint)!bVar70 * auVar120._8_4_;
      bVar70 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar70 * auVar121._12_4_ | (uint)!bVar70 * auVar120._12_4_;
      bVar70 = (bool)((byte)(uVar73 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar70 * auVar121._16_4_ | (uint)!bVar70 * auVar120._16_4_;
      bVar70 = (bool)((byte)(uVar73 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar70 * auVar121._20_4_ | (uint)!bVar70 * auVar120._20_4_;
      bVar70 = (bool)((byte)(uVar73 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar70 * auVar121._24_4_ | (uint)!bVar70 * auVar120._24_4_;
      bVar70 = SUB81(uVar73 >> 7,0);
      auVar123._28_4_ = (uint)bVar70 * auVar121._28_4_ | (uint)!bVar70 * auVar120._28_4_;
      auVar154._8_4_ = 0x7fffffff;
      auVar154._0_8_ = 0x7fffffff7fffffff;
      auVar154._12_4_ = 0x7fffffff;
      auVar154._16_4_ = 0x7fffffff;
      auVar154._20_4_ = 0x7fffffff;
      auVar154._24_4_ = 0x7fffffff;
      auVar154._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_540,auVar154);
      auVar120 = vmaxps_avx512vl(local_3c0,local_540);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      auVar121 = vmulps_avx512vl(auVar120,auVar27);
      auVar120 = vandps_avx(auVar108,auVar154);
      uVar60 = vcmpps_avx512vl(auVar120,auVar121,1);
      uVar73 = uVar73 & uVar60;
      bVar63 = (byte)uVar73;
      if (bVar63 != 0) {
        uVar60 = vcmpps_avx512vl(auVar118,_DAT_02020f00,2);
        auVar181._8_4_ = 0xff800000;
        auVar181._0_8_ = 0xff800000ff800000;
        auVar181._12_4_ = 0xff800000;
        auVar181._16_4_ = 0xff800000;
        auVar181._20_4_ = 0xff800000;
        auVar181._24_4_ = 0xff800000;
        auVar181._28_4_ = 0xff800000;
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar121 = vblendmps_avx512vl(auVar118,auVar181);
        bVar57 = (byte)uVar60;
        uVar61 = (uint)(bVar57 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar120._0_4_;
        bVar70 = (bool)((byte)(uVar60 >> 1) & 1);
        uVar138 = (uint)bVar70 * auVar121._4_4_ | (uint)!bVar70 * auVar120._4_4_;
        bVar70 = (bool)((byte)(uVar60 >> 2) & 1);
        uVar139 = (uint)bVar70 * auVar121._8_4_ | (uint)!bVar70 * auVar120._8_4_;
        bVar70 = (bool)((byte)(uVar60 >> 3) & 1);
        uVar140 = (uint)bVar70 * auVar121._12_4_ | (uint)!bVar70 * auVar120._12_4_;
        bVar70 = (bool)((byte)(uVar60 >> 4) & 1);
        uVar141 = (uint)bVar70 * auVar121._16_4_ | (uint)!bVar70 * auVar120._16_4_;
        bVar70 = (bool)((byte)(uVar60 >> 5) & 1);
        uVar142 = (uint)bVar70 * auVar121._20_4_ | (uint)!bVar70 * auVar120._20_4_;
        bVar70 = (bool)((byte)(uVar60 >> 6) & 1);
        uVar143 = (uint)bVar70 * auVar121._24_4_ | (uint)!bVar70 * auVar120._24_4_;
        bVar70 = SUB81(uVar60 >> 7,0);
        uVar144 = (uint)bVar70 * auVar121._28_4_ | (uint)!bVar70 * auVar120._28_4_;
        auVar124._0_4_ = (bVar63 & 1) * uVar61 | !(bool)(bVar63 & 1) * auVar124._0_4_;
        bVar70 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar124._4_4_ = bVar70 * uVar138 | !bVar70 * auVar124._4_4_;
        bVar70 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar124._8_4_ = bVar70 * uVar139 | !bVar70 * auVar124._8_4_;
        bVar70 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar124._12_4_ = bVar70 * uVar140 | !bVar70 * auVar124._12_4_;
        bVar70 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar124._16_4_ = bVar70 * uVar141 | !bVar70 * auVar124._16_4_;
        bVar70 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar124._20_4_ = bVar70 * uVar142 | !bVar70 * auVar124._20_4_;
        bVar70 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar124._24_4_ = bVar70 * uVar143 | !bVar70 * auVar124._24_4_;
        bVar70 = SUB81(uVar73 >> 7,0);
        auVar124._28_4_ = bVar70 * uVar144 | !bVar70 * auVar124._28_4_;
        auVar118 = vblendmps_avx512vl(auVar181,auVar118);
        bVar70 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar60 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar60 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar60 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar60 >> 6) & 1);
        bVar12 = SUB81(uVar60 >> 7,0);
        auVar123._0_4_ =
             (uint)(bVar63 & 1) *
             ((uint)(bVar57 & 1) * auVar118._0_4_ | !(bool)(bVar57 & 1) * uVar61) |
             !(bool)(bVar63 & 1) * auVar123._0_4_;
        bVar6 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar123._4_4_ =
             (uint)bVar6 * ((uint)bVar70 * auVar118._4_4_ | !bVar70 * uVar138) |
             !bVar6 * auVar123._4_4_;
        bVar70 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar123._8_4_ =
             (uint)bVar70 * ((uint)bVar7 * auVar118._8_4_ | !bVar7 * uVar139) |
             !bVar70 * auVar123._8_4_;
        bVar70 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar123._12_4_ =
             (uint)bVar70 * ((uint)bVar8 * auVar118._12_4_ | !bVar8 * uVar140) |
             !bVar70 * auVar123._12_4_;
        bVar70 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar123._16_4_ =
             (uint)bVar70 * ((uint)bVar10 * auVar118._16_4_ | !bVar10 * uVar141) |
             !bVar70 * auVar123._16_4_;
        bVar70 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar123._20_4_ =
             (uint)bVar70 * ((uint)bVar9 * auVar118._20_4_ | !bVar9 * uVar142) |
             !bVar70 * auVar123._20_4_;
        bVar70 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar123._24_4_ =
             (uint)bVar70 * ((uint)bVar11 * auVar118._24_4_ | !bVar11 * uVar143) |
             !bVar70 * auVar123._24_4_;
        bVar70 = SUB81(uVar73 >> 7,0);
        auVar123._28_4_ =
             (uint)bVar70 * ((uint)bVar12 * auVar118._28_4_ | !bVar12 * uVar144) |
             !bVar70 * auVar123._28_4_;
        bVar58 = (~bVar63 | bVar57) & bVar58;
      }
    }
    in_ZMM31 = ZEXT3264(auVar123);
    if ((bVar58 & 0x7f) == 0) {
      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar250 = ZEXT3264(auVar83);
      auVar126._8_4_ = 0x3f800000;
      auVar126._0_8_ = &DAT_3f8000003f800000;
      auVar126._12_4_ = 0x3f800000;
      auVar126._16_4_ = 0x3f800000;
      auVar126._20_4_ = 0x3f800000;
      auVar126._24_4_ = 0x3f800000;
      auVar126._28_4_ = 0x3f800000;
LAB_01d7c726:
      auVar213 = ZEXT3264(auVar126);
      auVar238 = ZEXT3264(local_6e0);
      auVar203 = ZEXT3264(local_600);
      auVar220 = ZEXT3264(local_740);
    }
    else {
      fVar225 = *(float *)(ray + k * 4 + 0x100) - (float)local_660._0_4_;
      auVar155._4_4_ = fVar225;
      auVar155._0_4_ = fVar225;
      auVar155._8_4_ = fVar225;
      auVar155._12_4_ = fVar225;
      auVar155._16_4_ = fVar225;
      auVar155._20_4_ = fVar225;
      auVar155._24_4_ = fVar225;
      auVar155._28_4_ = fVar225;
      auVar118 = vminps_avx512vl(auVar155,auVar123);
      auVar54._4_4_ = fStack_1fc;
      auVar54._0_4_ = local_200;
      auVar54._8_4_ = fStack_1f8;
      auVar54._12_4_ = fStack_1f4;
      auVar54._16_4_ = fStack_1f0;
      auVar54._20_4_ = fStack_1ec;
      auVar54._24_4_ = fStack_1e8;
      auVar54._28_4_ = fStack_1e4;
      auVar120 = vmaxps_avx512vl(auVar54,auVar124);
      auVar113 = vmulps_avx512vl(auVar113,auVar247);
      auVar112 = vfmadd213ps_avx512vl(auVar112,auVar243,auVar113);
      auVar111 = vfmadd213ps_avx512vl(auVar111,auVar125,auVar112);
      auVar112 = vmulps_avx512vl(local_500,auVar247);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar86,auVar243);
      auVar112 = vfmadd231ps_avx512vl(auVar112,local_520,auVar125);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar250 = ZEXT3264(auVar124);
      vandps_avx512vl(auVar112,auVar124);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar16 = vcmpps_avx512vl(auVar124,auVar113,1);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM31 = ZEXT3264(auVar125);
      auVar111 = vxorps_avx512vl(auVar111,auVar125);
      auVar121 = vrcp14ps_avx512vl(auVar112);
      auVar122 = vxorps_avx512vl(auVar112,auVar125);
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar127 = vfnmadd213ps_avx512vl(auVar121,auVar112,auVar126);
      auVar127 = vfmadd132ps_avx512vl(auVar127,auVar121,auVar121);
      auVar127 = vmulps_avx512vl(auVar127,auVar111);
      uVar18 = vcmpps_avx512vl(auVar112,auVar122,1);
      bVar63 = (byte)uVar16 | (byte)uVar18;
      auVar128 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar111 = vblendmps_avx512vl(auVar127,auVar128);
      auVar129._0_4_ =
           (uint)(bVar63 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar121._0_4_;
      bVar70 = (bool)(bVar63 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar70 * auVar111._4_4_ | (uint)!bVar70 * auVar121._4_4_;
      bVar70 = (bool)(bVar63 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar70 * auVar111._8_4_ | (uint)!bVar70 * auVar121._8_4_;
      bVar70 = (bool)(bVar63 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar70 * auVar111._12_4_ | (uint)!bVar70 * auVar121._12_4_;
      bVar70 = (bool)(bVar63 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar70 * auVar111._16_4_ | (uint)!bVar70 * auVar121._16_4_;
      bVar70 = (bool)(bVar63 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar70 * auVar111._20_4_ | (uint)!bVar70 * auVar121._20_4_;
      bVar70 = (bool)(bVar63 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar70 * auVar111._24_4_ | (uint)!bVar70 * auVar121._24_4_;
      auVar129._28_4_ =
           (uint)(bVar63 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar63 >> 7) * auVar121._28_4_;
      auVar111 = vmaxps_avx(auVar120,auVar129);
      uVar18 = vcmpps_avx512vl(auVar112,auVar122,6);
      bVar63 = (byte)uVar16 | (byte)uVar18;
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar130._0_4_ =
           (uint)(bVar63 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar127._0_4_;
      bVar70 = (bool)(bVar63 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar70 * auVar120._4_4_ | (uint)!bVar70 * auVar127._4_4_;
      bVar70 = (bool)(bVar63 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar70 * auVar120._8_4_ | (uint)!bVar70 * auVar127._8_4_;
      bVar70 = (bool)(bVar63 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar70 * auVar120._12_4_ | (uint)!bVar70 * auVar127._12_4_;
      bVar70 = (bool)(bVar63 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar70 * auVar120._16_4_ | (uint)!bVar70 * auVar127._16_4_;
      bVar70 = (bool)(bVar63 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar70 * auVar120._20_4_ | (uint)!bVar70 * auVar127._20_4_;
      bVar70 = (bool)(bVar63 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar70 * auVar120._24_4_ | (uint)!bVar70 * auVar127._24_4_;
      auVar130._28_4_ =
           (uint)(bVar63 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar63 >> 7) * auVar127._28_4_;
      auVar112 = vminps_avx(auVar118,auVar130);
      auVar100 = vsubps_avx(ZEXT832(0) << 0x20,auVar100);
      auVar103 = vsubps_avx(ZEXT832(0) << 0x20,auVar103);
      auVar118 = ZEXT832(0) << 0x20;
      auVar104 = vsubps_avx(auVar118,auVar104);
      auVar37._4_4_ = auVar104._4_4_ * auVar109._4_4_;
      auVar37._0_4_ = auVar104._0_4_ * auVar109._0_4_;
      auVar37._8_4_ = auVar104._8_4_ * auVar109._8_4_;
      auVar37._12_4_ = auVar104._12_4_ * auVar109._12_4_;
      auVar37._16_4_ = auVar104._16_4_ * auVar109._16_4_;
      auVar37._20_4_ = auVar104._20_4_ * auVar109._20_4_;
      auVar37._24_4_ = auVar104._24_4_ * auVar109._24_4_;
      auVar37._28_4_ = auVar104._28_4_;
      auVar103 = vfnmsub231ps_avx512vl(auVar37,auVar107,auVar103);
      auVar100 = vfnmadd231ps_avx512vl(auVar103,auVar106,auVar100);
      auVar103 = vmulps_avx512vl(local_500,auVar109);
      auVar103 = vfnmsub231ps_avx512vl(auVar103,auVar86,auVar107);
      auVar103 = vfnmadd231ps_avx512vl(auVar103,local_520,auVar106);
      vandps_avx512vl(auVar103,auVar124);
      uVar16 = vcmpps_avx512vl(auVar103,auVar113,1);
      auVar100 = vxorps_avx512vl(auVar100,auVar125);
      auVar104 = vrcp14ps_avx512vl(auVar103);
      auVar106 = vxorps_avx512vl(auVar103,auVar125);
      auVar113 = vfnmadd213ps_avx512vl(auVar104,auVar103,auVar126);
      auVar74 = vfmadd132ps_fma(auVar113,auVar104,auVar104);
      fVar225 = auVar74._0_4_ * auVar100._0_4_;
      fVar232 = auVar74._4_4_ * auVar100._4_4_;
      auVar38._4_4_ = fVar232;
      auVar38._0_4_ = fVar225;
      fVar233 = auVar74._8_4_ * auVar100._8_4_;
      auVar38._8_4_ = fVar233;
      fVar234 = auVar74._12_4_ * auVar100._12_4_;
      auVar38._12_4_ = fVar234;
      fVar240 = auVar100._16_4_ * 0.0;
      auVar38._16_4_ = fVar240;
      fVar235 = auVar100._20_4_ * 0.0;
      auVar38._20_4_ = fVar235;
      fVar204 = auVar100._24_4_ * 0.0;
      auVar38._24_4_ = fVar204;
      auVar38._28_4_ = auVar100._28_4_;
      uVar18 = vcmpps_avx512vl(auVar103,auVar106,1);
      bVar63 = (byte)uVar16 | (byte)uVar18;
      auVar113 = vblendmps_avx512vl(auVar38,auVar128);
      auVar131._0_4_ =
           (uint)(bVar63 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar104._0_4_;
      bVar70 = (bool)(bVar63 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar70 * auVar113._4_4_ | (uint)!bVar70 * auVar104._4_4_;
      bVar70 = (bool)(bVar63 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar70 * auVar113._8_4_ | (uint)!bVar70 * auVar104._8_4_;
      bVar70 = (bool)(bVar63 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar70 * auVar113._12_4_ | (uint)!bVar70 * auVar104._12_4_;
      bVar70 = (bool)(bVar63 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar70 * auVar113._16_4_ | (uint)!bVar70 * auVar104._16_4_;
      bVar70 = (bool)(bVar63 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar70 * auVar113._20_4_ | (uint)!bVar70 * auVar104._20_4_;
      bVar70 = (bool)(bVar63 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar70 * auVar113._24_4_ | (uint)!bVar70 * auVar104._24_4_;
      auVar131._28_4_ =
           (uint)(bVar63 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar63 >> 7) * auVar104._28_4_;
      _local_560 = vmaxps_avx(auVar111,auVar131);
      uVar18 = vcmpps_avx512vl(auVar103,auVar106,6);
      bVar63 = (byte)uVar16 | (byte)uVar18;
      auVar132._0_4_ =
           (uint)(bVar63 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar63 & 1) * (int)fVar225;
      bVar70 = (bool)(bVar63 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar70 * auVar120._4_4_ | (uint)!bVar70 * (int)fVar232;
      bVar70 = (bool)(bVar63 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar70 * auVar120._8_4_ | (uint)!bVar70 * (int)fVar233;
      bVar70 = (bool)(bVar63 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar70 * auVar120._12_4_ | (uint)!bVar70 * (int)fVar234;
      bVar70 = (bool)(bVar63 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar70 * auVar120._16_4_ | (uint)!bVar70 * (int)fVar240;
      bVar70 = (bool)(bVar63 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar70 * auVar120._20_4_ | (uint)!bVar70 * (int)fVar235;
      bVar70 = (bool)(bVar63 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar70 * auVar120._24_4_ | (uint)!bVar70 * (int)fVar204;
      auVar132._28_4_ =
           (uint)(bVar63 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar63 >> 7) * auVar100._28_4_;
      local_260 = vminps_avx(auVar112,auVar132);
      uVar16 = vcmpps_avx512vl(_local_560,local_260,2);
      bVar58 = bVar58 & 0x7f & (byte)uVar16;
      if (bVar58 == 0) goto LAB_01d7c726;
      auVar83 = vmaxps_avx(auVar118,auVar83);
      auVar100 = vminps_avx512vl(local_460,auVar126);
      auVar45 = ZEXT412(0);
      auVar103 = ZEXT1232(auVar45) << 0x20;
      auVar100 = vmaxps_avx(auVar100,ZEXT1232(auVar45) << 0x20);
      auVar104 = vminps_avx512vl(local_480,auVar126);
      auVar39._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
      auVar39._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
      auVar39._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
      auVar39._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
      auVar39._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
      auVar39._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
      auVar39._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
      auVar39._28_4_ = auVar100._28_4_ + 7.0;
      local_460 = vfmadd213ps_avx512vl(auVar39,local_720,auVar224);
      auVar100 = vmaxps_avx(auVar104,ZEXT1232(auVar45) << 0x20);
      auVar40._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
      auVar40._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
      auVar40._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
      auVar40._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
      auVar40._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
      auVar40._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
      auVar40._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
      auVar40._28_4_ = auVar100._28_4_ + 7.0;
      local_480 = vfmadd213ps_avx512vl(auVar40,local_720,auVar224);
      auVar41._4_4_ = auVar83._4_4_ * auVar83._4_4_;
      auVar41._0_4_ = auVar83._0_4_ * auVar83._0_4_;
      auVar41._8_4_ = auVar83._8_4_ * auVar83._8_4_;
      auVar41._12_4_ = auVar83._12_4_ * auVar83._12_4_;
      auVar41._16_4_ = auVar83._16_4_ * auVar83._16_4_;
      auVar41._20_4_ = auVar83._20_4_ * auVar83._20_4_;
      auVar41._24_4_ = auVar83._24_4_ * auVar83._24_4_;
      auVar41._28_4_ = local_480._28_4_;
      auVar83 = vsubps_avx(auVar115,auVar41);
      auVar100 = vmulps_avx512vl(auVar114,auVar83);
      auVar100 = vsubps_avx512vl(auVar119,auVar100);
      uVar16 = vcmpps_avx512vl(auVar100,ZEXT1232(auVar45) << 0x20,5);
      bVar63 = (byte)uVar16;
      if (bVar63 == 0) {
        auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar203 = ZEXT864(0) << 0x20;
        auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar104 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar239 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar133._8_4_ = 0x7f800000;
        auVar133._0_8_ = 0x7f8000007f800000;
        auVar133._12_4_ = 0x7f800000;
        auVar133._16_4_ = 0x7f800000;
        auVar133._20_4_ = 0x7f800000;
        auVar133._24_4_ = 0x7f800000;
        auVar133._28_4_ = 0x7f800000;
        auVar134._8_4_ = 0xff800000;
        auVar134._0_8_ = 0xff800000ff800000;
        auVar134._12_4_ = 0xff800000;
        auVar134._16_4_ = 0xff800000;
        auVar134._20_4_ = 0xff800000;
        auVar134._24_4_ = 0xff800000;
        auVar134._28_4_ = 0xff800000;
      }
      else {
        auVar76 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
        uVar73 = vcmpps_avx512vl(auVar100,auVar118,5);
        auVar100 = vsqrtps_avx(auVar100);
        auVar176._0_4_ = auVar108._0_4_ + auVar108._0_4_;
        auVar176._4_4_ = auVar108._4_4_ + auVar108._4_4_;
        auVar176._8_4_ = auVar108._8_4_ + auVar108._8_4_;
        auVar176._12_4_ = auVar108._12_4_ + auVar108._12_4_;
        auVar176._16_4_ = auVar108._16_4_ + auVar108._16_4_;
        auVar176._20_4_ = auVar108._20_4_ + auVar108._20_4_;
        auVar176._24_4_ = auVar108._24_4_ + auVar108._24_4_;
        auVar176._28_4_ = auVar108._28_4_ + auVar108._28_4_;
        auVar103 = vrcp14ps_avx512vl(auVar176);
        auVar104 = vfnmadd213ps_avx512vl(auVar176,auVar103,auVar126);
        auVar74 = vfmadd132ps_fma(auVar104,auVar103,auVar103);
        auVar28._8_4_ = 0x80000000;
        auVar28._0_8_ = 0x8000000080000000;
        auVar28._12_4_ = 0x80000000;
        auVar28._16_4_ = 0x80000000;
        auVar28._20_4_ = 0x80000000;
        auVar28._24_4_ = 0x80000000;
        auVar28._28_4_ = 0x80000000;
        auVar103 = vxorps_avx512vl(auVar117,auVar28);
        auVar103 = vsubps_avx(auVar103,auVar100);
        auVar42._4_4_ = auVar103._4_4_ * auVar74._4_4_;
        auVar42._0_4_ = auVar103._0_4_ * auVar74._0_4_;
        auVar42._8_4_ = auVar103._8_4_ * auVar74._8_4_;
        auVar42._12_4_ = auVar103._12_4_ * auVar74._12_4_;
        auVar42._16_4_ = auVar103._16_4_ * 0.0;
        auVar42._20_4_ = auVar103._20_4_ * 0.0;
        auVar42._24_4_ = auVar103._24_4_ * 0.0;
        auVar42._28_4_ = 0x3e000000;
        auVar100 = vsubps_avx512vl(auVar100,auVar117);
        auVar248._0_4_ = auVar100._0_4_ * auVar74._0_4_;
        auVar248._4_4_ = auVar100._4_4_ * auVar74._4_4_;
        auVar248._8_4_ = auVar100._8_4_ * auVar74._8_4_;
        auVar248._12_4_ = auVar100._12_4_ * auVar74._12_4_;
        auVar248._16_4_ = auVar100._16_4_ * 0.0;
        auVar248._20_4_ = auVar100._20_4_ * 0.0;
        auVar248._24_4_ = auVar100._24_4_ * 0.0;
        auVar248._28_4_ = 0;
        auVar100 = vfmadd213ps_avx512vl(auVar116,auVar42,auVar97);
        auVar43._4_4_ = auVar105._4_4_ * auVar100._4_4_;
        auVar43._0_4_ = auVar105._0_4_ * auVar100._0_4_;
        auVar43._8_4_ = auVar105._8_4_ * auVar100._8_4_;
        auVar43._12_4_ = auVar105._12_4_ * auVar100._12_4_;
        auVar43._16_4_ = auVar105._16_4_ * auVar100._16_4_;
        auVar43._20_4_ = auVar105._20_4_ * auVar100._20_4_;
        auVar43._24_4_ = auVar105._24_4_ * auVar100._24_4_;
        auVar43._28_4_ = auVar103._28_4_;
        auVar100 = vmulps_avx512vl(local_520,auVar42);
        auVar103 = vmulps_avx512vl(auVar86,auVar42);
        auVar106 = vmulps_avx512vl(local_500,auVar42);
        auVar104 = vfmadd213ps_avx512vl(auVar98,auVar43,auVar101);
        auVar100 = vsubps_avx512vl(auVar100,auVar104);
        auVar104 = vfmadd213ps_avx512vl(auVar99,auVar43,auVar102);
        auVar104 = vsubps_avx512vl(auVar103,auVar104);
        auVar74 = vfmadd213ps_fma(auVar43,auVar110,local_6c0);
        auVar103 = vsubps_avx(auVar106,ZEXT1632(auVar74));
        auVar239 = auVar103._0_28_;
        auVar97 = vfmadd213ps_avx512vl(auVar116,auVar248,auVar97);
        auVar105 = vmulps_avx512vl(auVar105,auVar97);
        auVar97 = vmulps_avx512vl(local_520,auVar248);
        auVar106 = vmulps_avx512vl(auVar86,auVar248);
        auVar107 = vmulps_avx512vl(local_500,auVar248);
        auVar74 = vfmadd213ps_fma(auVar98,auVar105,auVar101);
        auVar103 = vsubps_avx(auVar97,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar99,auVar105,auVar102);
        auVar97 = vsubps_avx512vl(auVar106,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar110,auVar105,local_6c0);
        auVar98 = vsubps_avx512vl(auVar107,ZEXT1632(auVar74));
        auVar203 = ZEXT3264(auVar98);
        auVar197._8_4_ = 0x7f800000;
        auVar197._0_8_ = 0x7f8000007f800000;
        auVar197._12_4_ = 0x7f800000;
        auVar197._16_4_ = 0x7f800000;
        auVar197._20_4_ = 0x7f800000;
        auVar197._24_4_ = 0x7f800000;
        auVar197._28_4_ = 0x7f800000;
        auVar98 = vblendmps_avx512vl(auVar197,auVar42);
        bVar70 = (bool)((byte)uVar73 & 1);
        auVar133._0_4_ = (uint)bVar70 * auVar98._0_4_ | (uint)!bVar70 * auVar101._0_4_;
        bVar70 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar70 * auVar98._4_4_ | (uint)!bVar70 * auVar101._4_4_;
        bVar70 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar70 * auVar98._8_4_ | (uint)!bVar70 * auVar101._8_4_;
        bVar70 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar70 * auVar98._12_4_ | (uint)!bVar70 * auVar101._12_4_;
        bVar70 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar133._16_4_ = (uint)bVar70 * auVar98._16_4_ | (uint)!bVar70 * auVar101._16_4_;
        bVar70 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar133._20_4_ = (uint)bVar70 * auVar98._20_4_ | (uint)!bVar70 * auVar101._20_4_;
        bVar70 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar133._24_4_ = (uint)bVar70 * auVar98._24_4_ | (uint)!bVar70 * auVar101._24_4_;
        bVar70 = SUB81(uVar73 >> 7,0);
        auVar133._28_4_ = (uint)bVar70 * auVar98._28_4_ | (uint)!bVar70 * auVar101._28_4_;
        auVar198._8_4_ = 0xff800000;
        auVar198._0_8_ = 0xff800000ff800000;
        auVar198._12_4_ = 0xff800000;
        auVar198._16_4_ = 0xff800000;
        auVar198._20_4_ = 0xff800000;
        auVar198._24_4_ = 0xff800000;
        auVar198._28_4_ = 0xff800000;
        auVar98 = vblendmps_avx512vl(auVar198,auVar248);
        bVar70 = (bool)((byte)uVar73 & 1);
        auVar134._0_4_ = (uint)bVar70 * auVar98._0_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar134._4_4_ = (uint)bVar70 * auVar98._4_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar134._8_4_ = (uint)bVar70 * auVar98._8_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar134._12_4_ = (uint)bVar70 * auVar98._12_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar134._16_4_ = (uint)bVar70 * auVar98._16_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar134._20_4_ = (uint)bVar70 * auVar98._20_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar134._24_4_ = (uint)bVar70 * auVar98._24_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = SUB81(uVar73 >> 7,0);
        auVar134._28_4_ = (uint)bVar70 * auVar98._28_4_ | (uint)!bVar70 * -0x800000;
        vandps_avx512vl(auVar124,local_540);
        auVar98 = vmaxps_avx(local_3c0,auVar134);
        auVar29._8_4_ = 0x36000000;
        auVar29._0_8_ = 0x3600000036000000;
        auVar29._12_4_ = 0x36000000;
        auVar29._16_4_ = 0x36000000;
        auVar29._20_4_ = 0x36000000;
        auVar29._24_4_ = 0x36000000;
        auVar29._28_4_ = 0x36000000;
        auVar98 = vmulps_avx512vl(auVar98,auVar29);
        vandps_avx512vl(auVar108,auVar124);
        uVar60 = vcmpps_avx512vl(auVar98,auVar98,1);
        uVar73 = uVar73 & uVar60;
        bVar57 = (byte)uVar73;
        if (bVar57 != 0) {
          uVar60 = vcmpps_avx512vl(auVar83,ZEXT1632(auVar76),2);
          auVar237._8_4_ = 0xff800000;
          auVar237._0_8_ = 0xff800000ff800000;
          auVar237._12_4_ = 0xff800000;
          auVar237._16_4_ = 0xff800000;
          auVar237._20_4_ = 0xff800000;
          auVar237._24_4_ = 0xff800000;
          auVar237._28_4_ = 0xff800000;
          auVar241._8_4_ = 0x7f800000;
          auVar241._0_8_ = 0x7f8000007f800000;
          auVar241._12_4_ = 0x7f800000;
          auVar241._16_4_ = 0x7f800000;
          auVar241._20_4_ = 0x7f800000;
          auVar241._24_4_ = 0x7f800000;
          auVar241._28_4_ = 0x7f800000;
          auVar83 = vblendmps_avx512vl(auVar241,auVar237);
          bVar62 = (byte)uVar60;
          uVar61 = (uint)(bVar62 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar98._0_4_;
          bVar70 = (bool)((byte)(uVar60 >> 1) & 1);
          uVar138 = (uint)bVar70 * auVar83._4_4_ | (uint)!bVar70 * auVar98._4_4_;
          bVar70 = (bool)((byte)(uVar60 >> 2) & 1);
          uVar139 = (uint)bVar70 * auVar83._8_4_ | (uint)!bVar70 * auVar98._8_4_;
          bVar70 = (bool)((byte)(uVar60 >> 3) & 1);
          uVar140 = (uint)bVar70 * auVar83._12_4_ | (uint)!bVar70 * auVar98._12_4_;
          bVar70 = (bool)((byte)(uVar60 >> 4) & 1);
          uVar141 = (uint)bVar70 * auVar83._16_4_ | (uint)!bVar70 * auVar98._16_4_;
          bVar70 = (bool)((byte)(uVar60 >> 5) & 1);
          uVar142 = (uint)bVar70 * auVar83._20_4_ | (uint)!bVar70 * auVar98._20_4_;
          bVar70 = (bool)((byte)(uVar60 >> 6) & 1);
          uVar143 = (uint)bVar70 * auVar83._24_4_ | (uint)!bVar70 * auVar98._24_4_;
          bVar70 = SUB81(uVar60 >> 7,0);
          uVar144 = (uint)bVar70 * auVar83._28_4_ | (uint)!bVar70 * auVar98._28_4_;
          auVar133._0_4_ = (bVar57 & 1) * uVar61 | !(bool)(bVar57 & 1) * auVar133._0_4_;
          bVar70 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar133._4_4_ = bVar70 * uVar138 | !bVar70 * auVar133._4_4_;
          bVar70 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar133._8_4_ = bVar70 * uVar139 | !bVar70 * auVar133._8_4_;
          bVar70 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar133._12_4_ = bVar70 * uVar140 | !bVar70 * auVar133._12_4_;
          bVar70 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar133._16_4_ = bVar70 * uVar141 | !bVar70 * auVar133._16_4_;
          bVar70 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar133._20_4_ = bVar70 * uVar142 | !bVar70 * auVar133._20_4_;
          bVar70 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar133._24_4_ = bVar70 * uVar143 | !bVar70 * auVar133._24_4_;
          bVar70 = SUB81(uVar73 >> 7,0);
          auVar133._28_4_ = bVar70 * uVar144 | !bVar70 * auVar133._28_4_;
          auVar83 = vblendmps_avx512vl(auVar237,auVar241);
          bVar70 = (bool)((byte)(uVar60 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar60 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar60 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar60 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar60 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar60 >> 6) & 1);
          bVar12 = SUB81(uVar60 >> 7,0);
          auVar134._0_4_ =
               (uint)(bVar57 & 1) *
               ((uint)(bVar62 & 1) * auVar83._0_4_ | !(bool)(bVar62 & 1) * uVar61) |
               !(bool)(bVar57 & 1) * auVar134._0_4_;
          bVar6 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar134._4_4_ =
               (uint)bVar6 * ((uint)bVar70 * auVar83._4_4_ | !bVar70 * uVar138) |
               !bVar6 * auVar134._4_4_;
          bVar70 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar134._8_4_ =
               (uint)bVar70 * ((uint)bVar7 * auVar83._8_4_ | !bVar7 * uVar139) |
               !bVar70 * auVar134._8_4_;
          bVar70 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar134._12_4_ =
               (uint)bVar70 * ((uint)bVar8 * auVar83._12_4_ | !bVar8 * uVar140) |
               !bVar70 * auVar134._12_4_;
          bVar70 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar134._16_4_ =
               (uint)bVar70 * ((uint)bVar10 * auVar83._16_4_ | !bVar10 * uVar141) |
               !bVar70 * auVar134._16_4_;
          bVar70 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar134._20_4_ =
               (uint)bVar70 * ((uint)bVar9 * auVar83._20_4_ | !bVar9 * uVar142) |
               !bVar70 * auVar134._20_4_;
          bVar70 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar134._24_4_ =
               (uint)bVar70 * ((uint)bVar11 * auVar83._24_4_ | !bVar11 * uVar143) |
               !bVar70 * auVar134._24_4_;
          bVar70 = SUB81(uVar73 >> 7,0);
          auVar134._28_4_ =
               (uint)bVar70 * ((uint)bVar12 * auVar83._28_4_ | !bVar12 * uVar144) |
               !bVar70 * auVar134._28_4_;
          bVar63 = (~bVar57 | bVar62) & bVar63;
        }
      }
      auVar213._0_4_ = local_500._0_4_ * auVar203._0_4_;
      auVar213._4_4_ = local_500._4_4_ * auVar203._4_4_;
      auVar213._8_4_ = local_500._8_4_ * auVar203._8_4_;
      auVar213._12_4_ = local_500._12_4_ * auVar203._12_4_;
      auVar213._16_4_ = local_500._16_4_ * auVar203._16_4_;
      auVar213._20_4_ = local_500._20_4_ * auVar203._20_4_;
      auVar213._28_36_ = auVar203._28_36_;
      auVar213._24_4_ = local_500._24_4_ * auVar203._24_4_;
      auVar83 = vfmadd231ps_avx512vl(auVar213._0_32_,auVar86,auVar97);
      auVar74 = vfmadd231ps_fma(auVar83,local_520,auVar103);
      _local_1c0 = _local_560;
      local_1a0 = vminps_avx(local_260,auVar133);
      vandps_avx512vl(ZEXT1632(auVar74),auVar124);
      _local_4c0 = vmaxps_avx(_local_560,auVar134);
      _local_280 = _local_4c0;
      auVar199._8_4_ = 0x3e99999a;
      auVar199._0_8_ = 0x3e99999a3e99999a;
      auVar199._12_4_ = 0x3e99999a;
      auVar199._16_4_ = 0x3e99999a;
      auVar199._20_4_ = 0x3e99999a;
      auVar199._24_4_ = 0x3e99999a;
      auVar199._28_4_ = 0x3e99999a;
      uVar16 = vcmpps_avx512vl(auVar83,auVar199,1);
      uVar18 = vcmpps_avx512vl(_local_560,local_1a0,2);
      bVar57 = (byte)uVar18 & bVar58;
      uVar17 = vcmpps_avx512vl(_local_4c0,local_260,2);
      if ((bVar58 & ((byte)uVar17 | (byte)uVar18)) == 0) {
        auVar213 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        auVar238 = ZEXT3264(local_6e0);
        auVar203 = ZEXT3264(local_600);
        auVar220 = ZEXT3264(local_740);
      }
      else {
        auVar44._4_4_ = auVar239._4_4_ * local_500._4_4_;
        auVar44._0_4_ = auVar239._0_4_ * local_500._0_4_;
        auVar44._8_4_ = auVar239._8_4_ * local_500._8_4_;
        auVar44._12_4_ = auVar239._12_4_ * local_500._12_4_;
        auVar44._16_4_ = auVar239._16_4_ * local_500._16_4_;
        auVar44._20_4_ = auVar239._20_4_ * local_500._20_4_;
        auVar44._24_4_ = auVar239._24_4_ * local_500._24_4_;
        auVar44._28_4_ = 0x3e99999a;
        auVar83 = vfmadd213ps_avx512vl(auVar104,auVar86,auVar44);
        auVar74 = vfmadd213ps_fma(auVar100,local_520,auVar83);
        vandps_avx512vl(ZEXT1632(auVar74),auVar124);
        uVar18 = vcmpps_avx512vl(auVar83,auVar199,1);
        bVar62 = (byte)uVar18 | ~bVar63;
        auVar156._8_4_ = 2;
        auVar156._0_8_ = 0x200000002;
        auVar156._12_4_ = 2;
        auVar156._16_4_ = 2;
        auVar156._20_4_ = 2;
        auVar156._24_4_ = 2;
        auVar156._28_4_ = 2;
        auVar30._8_4_ = 3;
        auVar30._0_8_ = 0x300000003;
        auVar30._12_4_ = 3;
        auVar30._16_4_ = 3;
        auVar30._20_4_ = 3;
        auVar30._24_4_ = 3;
        auVar30._28_4_ = 3;
        auVar83 = vpblendmd_avx512vl(auVar156,auVar30);
        local_240._0_4_ = (uint)(bVar62 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar62 & 1) * 2;
        bVar70 = (bool)(bVar62 >> 1 & 1);
        local_240._4_4_ = (uint)bVar70 * auVar83._4_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar62 >> 2 & 1);
        local_240._8_4_ = (uint)bVar70 * auVar83._8_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar62 >> 3 & 1);
        local_240._12_4_ = (uint)bVar70 * auVar83._12_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar62 >> 4 & 1);
        local_240._16_4_ = (uint)bVar70 * auVar83._16_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar62 >> 5 & 1);
        local_240._20_4_ = (uint)bVar70 * auVar83._20_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar62 >> 6 & 1);
        local_240._24_4_ = (uint)bVar70 * auVar83._24_4_ | (uint)!bVar70 * 2;
        local_240._28_4_ = (uint)(bVar62 >> 7) * auVar83._28_4_ | (uint)!(bool)(bVar62 >> 7) * 2;
        local_3e0 = vpbroadcastd_avx512vl();
        uVar18 = vpcmpd_avx512vl(local_3e0,local_240,5);
        bVar62 = (byte)uVar18 & bVar57;
        if (bVar62 == 0) {
          auVar216._8_4_ = 0x7fffffff;
          auVar216._0_8_ = 0x7fffffff7fffffff;
          auVar216._12_4_ = 0x7fffffff;
        }
        else {
          auVar76 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar74 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar77 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar78 = vminps_avx(auVar76,auVar77);
          auVar76 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar77 = vmaxps_avx(auVar74,auVar76);
          auVar182._8_4_ = 0x7fffffff;
          auVar182._0_8_ = 0x7fffffff7fffffff;
          auVar182._12_4_ = 0x7fffffff;
          auVar74 = vandps_avx(auVar78,auVar182);
          auVar76 = vandps_avx(auVar77,auVar182);
          auVar74 = vmaxps_avx(auVar74,auVar76);
          auVar76 = vmovshdup_avx(auVar74);
          auVar76 = vmaxss_avx(auVar76,auVar74);
          auVar74 = vshufpd_avx(auVar74,auVar74,1);
          auVar74 = vmaxss_avx(auVar74,auVar76);
          fVar225 = auVar74._0_4_ * 1.9073486e-06;
          local_670 = vshufps_avx(auVar77,auVar77,0xff);
          local_4a0 = (float)local_560._0_4_ + (float)local_4e0._0_4_;
          fStack_49c = (float)local_560._4_4_ + (float)local_4e0._4_4_;
          fStack_498 = fStack_558 + fStack_4d8;
          fStack_494 = fStack_554 + fStack_4d4;
          fStack_490 = fStack_550 + fStack_4d0;
          fStack_48c = fStack_54c + fStack_4cc;
          fStack_488 = fStack_548 + fStack_4c8;
          fStack_484 = fStack_544 + fStack_4c4;
          do {
            auVar157._8_4_ = 0x7f800000;
            auVar157._0_8_ = 0x7f8000007f800000;
            auVar157._12_4_ = 0x7f800000;
            auVar157._16_4_ = 0x7f800000;
            auVar157._20_4_ = 0x7f800000;
            auVar157._24_4_ = 0x7f800000;
            auVar157._28_4_ = 0x7f800000;
            auVar83 = vblendmps_avx512vl(auVar157,_local_560);
            auVar135._0_4_ =
                 (uint)(bVar62 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
            bVar70 = (bool)(bVar62 >> 1 & 1);
            auVar135._4_4_ = (uint)bVar70 * auVar83._4_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar62 >> 2 & 1);
            auVar135._8_4_ = (uint)bVar70 * auVar83._8_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar62 >> 3 & 1);
            auVar135._12_4_ = (uint)bVar70 * auVar83._12_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar62 >> 4 & 1);
            auVar135._16_4_ = (uint)bVar70 * auVar83._16_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar62 >> 5 & 1);
            auVar135._20_4_ = (uint)bVar70 * auVar83._20_4_ | (uint)!bVar70 * 0x7f800000;
            auVar135._24_4_ =
                 (uint)(bVar62 >> 6) * auVar83._24_4_ | (uint)!(bool)(bVar62 >> 6) * 0x7f800000;
            auVar135._28_4_ = 0x7f800000;
            auVar83 = vshufps_avx(auVar135,auVar135,0xb1);
            auVar83 = vminps_avx(auVar135,auVar83);
            auVar97 = vshufpd_avx(auVar83,auVar83,5);
            auVar83 = vminps_avx(auVar83,auVar97);
            auVar97 = vpermpd_avx2(auVar83,0x4e);
            auVar83 = vminps_avx(auVar83,auVar97);
            uVar18 = vcmpps_avx512vl(auVar135,auVar83,0);
            bVar55 = (byte)uVar18 & bVar62;
            bVar66 = bVar62;
            if (bVar55 != 0) {
              bVar66 = bVar55;
            }
            iVar19 = 0;
            for (uVar61 = (uint)bVar66; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            bVar66 = '\x01' << ((byte)iVar19 & 0x1f);
            fVar232 = *(float *)(local_460 + (uint)(iVar19 << 2));
            fVar233 = *(float *)(local_1c0 + (uint)(iVar19 << 2));
            fVar234 = auVar14._0_4_;
            if ((float)local_700._0_4_ < 0.0) {
              fVar234 = sqrtf((float)local_700._0_4_);
            }
            bVar55 = ~bVar66;
            lVar68 = 5;
            do {
              auVar146._4_4_ = fVar233;
              auVar146._0_4_ = fVar233;
              auVar146._8_4_ = fVar233;
              auVar146._12_4_ = fVar233;
              auVar76 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_6f0);
              fVar240 = 1.0 - fVar232;
              auVar183._0_4_ = local_5c0._0_4_ * fVar232;
              auVar183._4_4_ = local_5c0._4_4_ * fVar232;
              auVar183._8_4_ = local_5c0._8_4_ * fVar232;
              auVar183._12_4_ = local_5c0._12_4_ * fVar232;
              local_610 = ZEXT416((uint)fVar240);
              auVar206._4_4_ = fVar240;
              auVar206._0_4_ = fVar240;
              auVar206._8_4_ = fVar240;
              auVar206._12_4_ = fVar240;
              auVar74 = vfmadd231ps_fma(auVar183,auVar206,local_580._0_16_);
              auVar214._0_4_ = local_5a0._0_4_ * fVar232;
              auVar214._4_4_ = local_5a0._4_4_ * fVar232;
              auVar214._8_4_ = local_5a0._8_4_ * fVar232;
              auVar214._12_4_ = local_5a0._12_4_ * fVar232;
              auVar77 = vfmadd231ps_fma(auVar214,auVar206,local_5c0._0_16_);
              auVar222._0_4_ = fVar232 * (float)local_5e0._0_4_;
              auVar222._4_4_ = fVar232 * (float)local_5e0._4_4_;
              auVar222._8_4_ = fVar232 * fStack_5d8;
              auVar222._12_4_ = fVar232 * fStack_5d4;
              auVar78 = vfmadd231ps_fma(auVar222,auVar206,local_5a0._0_16_);
              auVar228._0_4_ = fVar232 * auVar77._0_4_;
              auVar228._4_4_ = fVar232 * auVar77._4_4_;
              auVar228._8_4_ = fVar232 * auVar77._8_4_;
              auVar228._12_4_ = fVar232 * auVar77._12_4_;
              auVar74 = vfmadd231ps_fma(auVar228,auVar206,auVar74);
              auVar184._0_4_ = fVar232 * auVar78._0_4_;
              auVar184._4_4_ = fVar232 * auVar78._4_4_;
              auVar184._8_4_ = fVar232 * auVar78._8_4_;
              auVar184._12_4_ = fVar232 * auVar78._12_4_;
              auVar77 = vfmadd231ps_fma(auVar184,auVar206,auVar77);
              auVar215._0_4_ = fVar232 * auVar77._0_4_;
              auVar215._4_4_ = fVar232 * auVar77._4_4_;
              auVar215._8_4_ = fVar232 * auVar77._8_4_;
              auVar215._12_4_ = fVar232 * auVar77._12_4_;
              auVar78 = vfmadd231ps_fma(auVar215,auVar74,auVar206);
              auVar74 = vsubps_avx(auVar77,auVar74);
              auVar20._8_4_ = 0x40400000;
              auVar20._0_8_ = 0x4040000040400000;
              auVar20._12_4_ = 0x40400000;
              auVar77 = vmulps_avx512vl(auVar74,auVar20);
              local_540._0_16_ = auVar78;
              auVar74 = vsubps_avx(auVar76,auVar78);
              local_720._0_16_ = auVar74;
              auVar74 = vdpps_avx(auVar74,auVar74,0x7f);
              local_6c0._0_16_ = auVar74;
              local_9c0 = ZEXT416((uint)fVar232);
              if (auVar74._0_4_ < 0.0) {
                auVar203._0_4_ = sqrtf(auVar74._0_4_);
                auVar203._4_60_ = extraout_var;
                auVar74 = auVar203._0_16_;
              }
              else {
                auVar74 = vsqrtss_avx(auVar74,auVar74);
              }
              local_620 = vdpps_avx(auVar77,auVar77,0x7f);
              fVar240 = local_620._0_4_;
              auVar185._4_12_ = ZEXT812(0) << 0x20;
              auVar185._0_4_ = fVar240;
              auVar76 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar185);
              fVar235 = auVar76._0_4_;
              local_630 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar185);
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar78 = vxorps_avx512vl(local_620,auVar21);
              auVar76 = vfnmadd213ss_fma(local_630,local_620,ZEXT416(0x40000000));
              uVar61 = auVar74._0_4_;
              if (fVar240 < auVar78._0_4_) {
                auVar220._0_4_ = sqrtf(fVar240);
                auVar220._4_60_ = extraout_var_00;
                auVar74 = ZEXT416(uVar61);
                auVar78 = auVar220._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx512f(local_620,local_620);
              }
              fVar240 = fVar235 * 1.5 + fVar240 * -0.5 * fVar235 * fVar235 * fVar235;
              local_640._0_4_ = auVar77._0_4_ * fVar240;
              local_640._4_4_ = auVar77._4_4_ * fVar240;
              local_640._8_4_ = auVar77._8_4_ * fVar240;
              local_640._12_4_ = auVar77._12_4_ * fVar240;
              auVar1 = vdpps_avx(local_720._0_16_,local_640,0x7f);
              auVar79 = vaddss_avx512f(auVar74,ZEXT416(0x3f800000));
              auVar147._0_4_ = auVar1._0_4_ * auVar1._0_4_;
              auVar147._4_4_ = auVar1._4_4_ * auVar1._4_4_;
              auVar147._8_4_ = auVar1._8_4_ * auVar1._8_4_;
              auVar147._12_4_ = auVar1._12_4_ * auVar1._12_4_;
              auVar75 = vsubps_avx(local_6c0._0_16_,auVar147);
              fVar235 = auVar75._0_4_;
              auVar164._4_12_ = ZEXT812(0) << 0x20;
              auVar164._0_4_ = fVar235;
              auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar164);
              fVar204 = auVar80._0_4_;
              uVar71 = fVar235 == 0.0;
              uVar69 = fVar235 < 0.0;
              if ((bool)uVar69) {
                local_650 = fVar240;
                fStack_64c = fVar240;
                fStack_648 = fVar240;
                fStack_644 = fVar240;
                fVar236 = sqrtf(fVar235);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar74 = ZEXT416(uVar61);
                auVar79 = ZEXT416(auVar79._0_4_);
                fVar240 = local_650;
                fVar244 = fStack_64c;
                fVar245 = fStack_648;
                fVar246 = fStack_644;
              }
              else {
                auVar75 = vsqrtss_avx(auVar75,auVar75);
                fVar236 = auVar75._0_4_;
                fVar244 = fVar240;
                fVar245 = fVar240;
                fVar246 = fVar240;
              }
              auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9c0,local_610);
              fVar163 = auVar75._0_4_ * 6.0;
              fVar15 = fVar232 * 6.0;
              auVar186._0_4_ = fVar15 * (float)local_5e0._0_4_;
              auVar186._4_4_ = fVar15 * (float)local_5e0._4_4_;
              auVar186._8_4_ = fVar15 * fStack_5d8;
              auVar186._12_4_ = fVar15 * fStack_5d4;
              auVar165._4_4_ = fVar163;
              auVar165._0_4_ = fVar163;
              auVar165._8_4_ = fVar163;
              auVar165._12_4_ = fVar163;
              auVar75 = vfmadd132ps_fma(auVar165,auVar186,local_5a0._0_16_);
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_610,local_9c0);
              fVar163 = auVar80._0_4_ * 6.0;
              auVar187._4_4_ = fVar163;
              auVar187._0_4_ = fVar163;
              auVar187._8_4_ = fVar163;
              auVar187._12_4_ = fVar163;
              auVar75 = vfmadd132ps_fma(auVar187,auVar75,local_5c0._0_16_);
              fVar163 = local_610._0_4_ * 6.0;
              auVar166._4_4_ = fVar163;
              auVar166._0_4_ = fVar163;
              auVar166._8_4_ = fVar163;
              auVar166._12_4_ = fVar163;
              auVar75 = vfmadd132ps_fma(auVar166,auVar75,local_580._0_16_);
              auVar188._0_4_ = auVar75._0_4_ * (float)local_620._0_4_;
              auVar188._4_4_ = auVar75._4_4_ * (float)local_620._0_4_;
              auVar188._8_4_ = auVar75._8_4_ * (float)local_620._0_4_;
              auVar188._12_4_ = auVar75._12_4_ * (float)local_620._0_4_;
              auVar75 = vdpps_avx(auVar77,auVar75,0x7f);
              fVar163 = auVar75._0_4_;
              auVar167._0_4_ = auVar77._0_4_ * fVar163;
              auVar167._4_4_ = auVar77._4_4_ * fVar163;
              auVar167._8_4_ = auVar77._8_4_ * fVar163;
              auVar167._12_4_ = auVar77._12_4_ * fVar163;
              auVar80 = vsubps_avx(auVar188,auVar167);
              fVar163 = auVar76._0_4_ * (float)local_630._0_4_;
              auVar75 = vmaxss_avx(ZEXT416((uint)fVar225),
                                   ZEXT416((uint)(fVar233 * fVar234 * 1.9073486e-06)));
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(auVar77,auVar22);
              auVar189._0_4_ = fVar240 * auVar80._0_4_ * fVar163;
              auVar189._4_4_ = fVar244 * auVar80._4_4_ * fVar163;
              auVar189._8_4_ = fVar245 * auVar80._8_4_ * fVar163;
              auVar189._12_4_ = fVar246 * auVar80._12_4_ * fVar163;
              auVar76 = vdpps_avx(auVar81,local_640,0x7f);
              auVar80 = vdivss_avx512f(ZEXT416((uint)fVar225),auVar78);
              auVar78 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar225),auVar75);
              auVar74 = vdpps_avx(local_720._0_16_,auVar189,0x7f);
              vfmadd213ss_avx512f(auVar79,auVar80,auVar78);
              fVar240 = auVar76._0_4_ + auVar74._0_4_;
              auVar74 = vdpps_avx(local_6f0,local_640,0x7f);
              auVar76 = vdpps_avx(local_720._0_16_,auVar81,0x7f);
              fVar235 = fVar204 * fVar235 * -0.5 * fVar204 * fVar204 + fVar204 * 1.5;
              auVar78 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
              in_ZMM31 = ZEXT1664(auVar1);
              auVar79 = vfnmadd231ss_avx512f(auVar76,auVar1,ZEXT416((uint)fVar240));
              auVar80 = vfnmadd231ss_avx512f(auVar78,auVar1,auVar74);
              auVar76 = vpermilps_avx(local_540._0_16_,0xff);
              fVar236 = fVar236 - auVar76._0_4_;
              auVar76 = vshufps_avx(auVar77,auVar77,0xff);
              auVar78 = vfmsub213ss_fma(auVar79,ZEXT416((uint)fVar235),auVar76);
              fVar235 = auVar80._0_4_ * fVar235;
              auVar79 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar78._0_4_)),
                                        ZEXT416((uint)fVar240),ZEXT416((uint)fVar235));
              fVar204 = auVar79._0_4_;
              auVar229._0_4_ = fVar235 / fVar204;
              auVar229._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar207._0_4_ = auVar78._0_4_ / fVar204;
              auVar207._4_12_ = auVar78._4_12_;
              auVar78 = vmulss_avx512f(auVar1,auVar229);
              auVar79 = vmulss_avx512f(auVar1,auVar207);
              fVar232 = fVar232 - (auVar78._0_4_ - fVar236 * (auVar74._0_4_ / fVar204));
              fVar233 = fVar233 - (fVar236 * (fVar240 / fVar204) - auVar79._0_4_);
              auVar216._8_4_ = 0x7fffffff;
              auVar216._0_8_ = 0x7fffffff7fffffff;
              auVar216._12_4_ = 0x7fffffff;
              auVar74 = vandps_avx512vl(auVar1,auVar216);
              auVar74 = vucomiss_avx512f(auVar74);
              bVar70 = true;
              if (!(bool)uVar69 && !(bool)uVar71) {
                auVar74 = vaddss_avx512f(auVar75,auVar74);
                auVar78 = vfmadd231ss_fma(auVar74,local_670,ZEXT416(0x36000000));
                auVar74 = vandps_avx(ZEXT416((uint)fVar236),auVar216);
                if (auVar74._0_4_ < auVar78._0_4_) {
                  fVar233 = fVar233 + (float)local_660._0_4_;
                  if ((((fVar145 <= fVar233) &&
                       (fVar240 = *(float *)(ray + k * 4 + 0x100), fVar233 <= fVar240)) &&
                      (0.0 <= fVar232)) && (fVar232 <= 1.0)) {
                    auVar46._12_4_ = 0;
                    auVar46._0_12_ = ZEXT812(0);
                    auVar74 = vrsqrt14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)local_6c0._0_4_));
                    fVar235 = auVar74._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar67].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar66 = true;
                      }
                      else {
                        fVar235 = fVar235 * 1.5 +
                                  (float)local_6c0._0_4_ * -0.5 * fVar235 * fVar235 * fVar235;
                        auVar168._0_4_ = local_720._0_4_ * fVar235;
                        auVar168._4_4_ = local_720._4_4_ * fVar235;
                        auVar168._8_4_ = local_720._8_4_ * fVar235;
                        auVar168._12_4_ = local_720._12_4_ * fVar235;
                        auVar78 = vfmadd213ps_fma(auVar76,auVar168,auVar77);
                        auVar74 = vshufps_avx(auVar168,auVar168,0xc9);
                        auVar76 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar169._0_4_ = auVar168._0_4_ * auVar76._0_4_;
                        auVar169._4_4_ = auVar168._4_4_ * auVar76._4_4_;
                        auVar169._8_4_ = auVar168._8_4_ * auVar76._8_4_;
                        auVar169._12_4_ = auVar168._12_4_ * auVar76._12_4_;
                        auVar77 = vfmsub231ps_fma(auVar169,auVar77,auVar74);
                        auVar74 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar76 = vshufps_avx(auVar78,auVar78,0xc9);
                        auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                        auVar148._0_4_ = auVar78._0_4_ * auVar77._0_4_;
                        auVar148._4_4_ = auVar78._4_4_ * auVar77._4_4_;
                        auVar148._8_4_ = auVar78._8_4_ * auVar77._8_4_;
                        auVar148._12_4_ = auVar78._12_4_ * auVar77._12_4_;
                        auVar74 = vfmsub231ps_fma(auVar148,auVar74,auVar76);
                        auVar200._8_4_ = 1;
                        auVar200._0_8_ = 0x100000001;
                        auVar200._12_4_ = 1;
                        auVar200._16_4_ = 1;
                        auVar200._20_4_ = 1;
                        auVar200._24_4_ = 1;
                        auVar200._28_4_ = 1;
                        auVar83 = vpermps_avx2(auVar200,ZEXT1632(auVar74));
                        auVar210._8_4_ = 2;
                        auVar210._0_8_ = 0x200000002;
                        auVar210._12_4_ = 2;
                        auVar210._16_4_ = 2;
                        auVar210._20_4_ = 2;
                        auVar210._24_4_ = 2;
                        auVar210._28_4_ = 2;
                        local_380 = vpermps_avx2(auVar210,ZEXT1632(auVar74));
                        local_360 = auVar74._0_4_;
                        local_3a0[0] = (RTCHitN)auVar83[0];
                        local_3a0[1] = (RTCHitN)auVar83[1];
                        local_3a0[2] = (RTCHitN)auVar83[2];
                        local_3a0[3] = (RTCHitN)auVar83[3];
                        local_3a0[4] = (RTCHitN)auVar83[4];
                        local_3a0[5] = (RTCHitN)auVar83[5];
                        local_3a0[6] = (RTCHitN)auVar83[6];
                        local_3a0[7] = (RTCHitN)auVar83[7];
                        local_3a0[8] = (RTCHitN)auVar83[8];
                        local_3a0[9] = (RTCHitN)auVar83[9];
                        local_3a0[10] = (RTCHitN)auVar83[10];
                        local_3a0[0xb] = (RTCHitN)auVar83[0xb];
                        local_3a0[0xc] = (RTCHitN)auVar83[0xc];
                        local_3a0[0xd] = (RTCHitN)auVar83[0xd];
                        local_3a0[0xe] = (RTCHitN)auVar83[0xe];
                        local_3a0[0xf] = (RTCHitN)auVar83[0xf];
                        local_3a0[0x10] = (RTCHitN)auVar83[0x10];
                        local_3a0[0x11] = (RTCHitN)auVar83[0x11];
                        local_3a0[0x12] = (RTCHitN)auVar83[0x12];
                        local_3a0[0x13] = (RTCHitN)auVar83[0x13];
                        local_3a0[0x14] = (RTCHitN)auVar83[0x14];
                        local_3a0[0x15] = (RTCHitN)auVar83[0x15];
                        local_3a0[0x16] = (RTCHitN)auVar83[0x16];
                        local_3a0[0x17] = (RTCHitN)auVar83[0x17];
                        local_3a0[0x18] = (RTCHitN)auVar83[0x18];
                        local_3a0[0x19] = (RTCHitN)auVar83[0x19];
                        local_3a0[0x1a] = (RTCHitN)auVar83[0x1a];
                        local_3a0[0x1b] = (RTCHitN)auVar83[0x1b];
                        local_3a0[0x1c] = (RTCHitN)auVar83[0x1c];
                        local_3a0[0x1d] = (RTCHitN)auVar83[0x1d];
                        local_3a0[0x1e] = (RTCHitN)auVar83[0x1e];
                        local_3a0[0x1f] = (RTCHitN)auVar83[0x1f];
                        uStack_35c = local_360;
                        uStack_358 = local_360;
                        uStack_354 = local_360;
                        uStack_350 = local_360;
                        uStack_34c = local_360;
                        uStack_348 = local_360;
                        uStack_344 = local_360;
                        local_340 = fVar232;
                        fStack_33c = fVar232;
                        fStack_338 = fVar232;
                        fStack_334 = fVar232;
                        fStack_330 = fVar232;
                        fStack_32c = fVar232;
                        fStack_328 = fVar232;
                        fStack_324 = fVar232;
                        local_320 = ZEXT432(0) << 0x20;
                        local_300 = local_400._0_8_;
                        uStack_2f8 = local_400._8_8_;
                        uStack_2f0 = local_400._16_8_;
                        uStack_2e8 = local_400._24_8_;
                        local_2e0 = local_420;
                        vpcmpeqd_avx2(local_420,local_420);
                        local_2c0 = context->user->instID[0];
                        uStack_2bc = local_2c0;
                        uStack_2b8 = local_2c0;
                        uStack_2b4 = local_2c0;
                        uStack_2b0 = local_2c0;
                        uStack_2ac = local_2c0;
                        uStack_2a8 = local_2c0;
                        uStack_2a4 = local_2c0;
                        local_2a0 = context->user->instPrimID[0];
                        uStack_29c = local_2a0;
                        uStack_298 = local_2a0;
                        uStack_294 = local_2a0;
                        uStack_290 = local_2a0;
                        uStack_28c = local_2a0;
                        uStack_288 = local_2a0;
                        uStack_284 = local_2a0;
                        *(float *)(ray + k * 4 + 0x100) = fVar233;
                        local_6a0 = local_440._0_8_;
                        uStack_698 = local_440._8_8_;
                        uStack_690 = local_440._16_8_;
                        uStack_688 = local_440._24_8_;
                        local_770.valid = (int *)&local_6a0;
                        local_770.geometryUserPtr = pGVar3->userPtr;
                        local_770.context = context->user;
                        local_770.hit = local_3a0;
                        local_770.N = 8;
                        local_770.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar3->occlusionFilterN)(&local_770);
                          auVar216._8_4_ = 0x7fffffff;
                          auVar216._0_8_ = 0x7fffffff7fffffff;
                          auVar216._12_4_ = 0x7fffffff;
                          auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        }
                        auVar48._8_8_ = uStack_698;
                        auVar48._0_8_ = local_6a0;
                        auVar48._16_8_ = uStack_690;
                        auVar48._24_8_ = uStack_688;
                        if (auVar48 == (undefined1  [32])0x0) {
                          bVar66 = false;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var5)(&local_770);
                            auVar216._8_4_ = 0x7fffffff;
                            auVar216._0_8_ = 0x7fffffff7fffffff;
                            auVar216._12_4_ = 0x7fffffff;
                            auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          }
                          auVar49._8_8_ = uStack_698;
                          auVar49._0_8_ = local_6a0;
                          auVar49._16_8_ = uStack_690;
                          auVar49._24_8_ = uStack_688;
                          uVar73 = vptestmd_avx512vl(auVar49,auVar49);
                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar70 = (bool)((byte)uVar73 & 1);
                          bVar6 = (bool)((byte)(uVar73 >> 1) & 1);
                          bVar7 = (bool)((byte)(uVar73 >> 2) & 1);
                          bVar8 = (bool)((byte)(uVar73 >> 3) & 1);
                          bVar10 = (bool)((byte)(uVar73 >> 4) & 1);
                          bVar9 = (bool)((byte)(uVar73 >> 5) & 1);
                          bVar11 = (bool)((byte)(uVar73 >> 6) & 1);
                          bVar12 = SUB81(uVar73 >> 7,0);
                          *(uint *)(local_770.ray + 0x100) =
                               (uint)bVar70 * auVar83._0_4_ |
                               (uint)!bVar70 * *(int *)(local_770.ray + 0x100);
                          *(uint *)(local_770.ray + 0x104) =
                               (uint)bVar6 * auVar83._4_4_ |
                               (uint)!bVar6 * *(int *)(local_770.ray + 0x104);
                          *(uint *)(local_770.ray + 0x108) =
                               (uint)bVar7 * auVar83._8_4_ |
                               (uint)!bVar7 * *(int *)(local_770.ray + 0x108);
                          *(uint *)(local_770.ray + 0x10c) =
                               (uint)bVar8 * auVar83._12_4_ |
                               (uint)!bVar8 * *(int *)(local_770.ray + 0x10c);
                          *(uint *)(local_770.ray + 0x110) =
                               (uint)bVar10 * auVar83._16_4_ |
                               (uint)!bVar10 * *(int *)(local_770.ray + 0x110);
                          *(uint *)(local_770.ray + 0x114) =
                               (uint)bVar9 * auVar83._20_4_ |
                               (uint)!bVar9 * *(int *)(local_770.ray + 0x114);
                          *(uint *)(local_770.ray + 0x118) =
                               (uint)bVar11 * auVar83._24_4_ |
                               (uint)!bVar11 * *(int *)(local_770.ray + 0x118);
                          *(uint *)(local_770.ray + 0x11c) =
                               (uint)bVar12 * auVar83._28_4_ |
                               (uint)!bVar12 * *(int *)(local_770.ray + 0x11c);
                          bVar66 = auVar49 != (undefined1  [32])0x0;
                        }
                        if ((bool)bVar66 == false) {
                          *(float *)(ray + k * 4 + 0x100) = fVar240;
                        }
                      }
                      bVar70 = false;
                      goto LAB_01d7cffa;
                    }
                  }
                  bVar70 = false;
                  bVar66 = 0;
                }
              }
LAB_01d7cffa:
              if (!bVar70) goto LAB_01d7d42c;
              lVar68 = lVar68 + -1;
            } while (lVar68 != 0);
            bVar66 = 0;
LAB_01d7d42c:
            bVar65 = bVar65 | bVar66 & 1;
            auVar52._4_4_ = fStack_49c;
            auVar52._0_4_ = local_4a0;
            auVar52._8_4_ = fStack_498;
            auVar52._12_4_ = fStack_494;
            auVar52._16_4_ = fStack_490;
            auVar52._20_4_ = fStack_48c;
            auVar52._24_4_ = fStack_488;
            auVar52._28_4_ = fStack_484;
            uVar205 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar31._4_4_ = uVar205;
            auVar31._0_4_ = uVar205;
            auVar31._8_4_ = uVar205;
            auVar31._12_4_ = uVar205;
            auVar31._16_4_ = uVar205;
            auVar31._20_4_ = uVar205;
            auVar31._24_4_ = uVar205;
            auVar31._28_4_ = uVar205;
            uVar18 = vcmpps_avx512vl(auVar52,auVar31,2);
            bVar62 = bVar55 & bVar62 & (byte)uVar18;
          } while (bVar62 != 0);
        }
        auVar158._0_4_ = (float)local_4e0._0_4_ + (float)local_4c0._0_4_;
        auVar158._4_4_ = (float)local_4e0._4_4_ + (float)local_4c0._4_4_;
        auVar158._8_4_ = fStack_4d8 + fStack_4b8;
        auVar158._12_4_ = fStack_4d4 + fStack_4b4;
        auVar158._16_4_ = fStack_4d0 + fStack_4b0;
        auVar158._20_4_ = fStack_4cc + fStack_4ac;
        auVar158._24_4_ = fStack_4c8 + fStack_4a8;
        auVar158._28_4_ = fStack_4c4 + fStack_4a4;
        uVar205 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar32._4_4_ = uVar205;
        auVar32._0_4_ = uVar205;
        auVar32._8_4_ = uVar205;
        auVar32._12_4_ = uVar205;
        auVar32._16_4_ = uVar205;
        auVar32._20_4_ = uVar205;
        auVar32._24_4_ = uVar205;
        auVar32._28_4_ = uVar205;
        uVar18 = vcmpps_avx512vl(auVar158,auVar32,2);
        bVar63 = (byte)uVar16 | ~bVar63;
        bVar58 = (byte)uVar17 & bVar58 & (byte)uVar18;
        auVar159._8_4_ = 2;
        auVar159._0_8_ = 0x200000002;
        auVar159._12_4_ = 2;
        auVar159._16_4_ = 2;
        auVar159._20_4_ = 2;
        auVar159._24_4_ = 2;
        auVar159._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar83 = vpblendmd_avx512vl(auVar159,auVar33);
        local_4c0._0_4_ = (uint)(bVar63 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar63 & 1) * 2;
        bVar70 = (bool)(bVar63 >> 1 & 1);
        local_4c0._4_4_ = (uint)bVar70 * auVar83._4_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar63 >> 2 & 1);
        fStack_4b8 = (float)((uint)bVar70 * auVar83._8_4_ | (uint)!bVar70 * 2);
        bVar70 = (bool)(bVar63 >> 3 & 1);
        fStack_4b4 = (float)((uint)bVar70 * auVar83._12_4_ | (uint)!bVar70 * 2);
        bVar70 = (bool)(bVar63 >> 4 & 1);
        fStack_4b0 = (float)((uint)bVar70 * auVar83._16_4_ | (uint)!bVar70 * 2);
        bVar70 = (bool)(bVar63 >> 5 & 1);
        fStack_4ac = (float)((uint)bVar70 * auVar83._20_4_ | (uint)!bVar70 * 2);
        bVar70 = (bool)(bVar63 >> 6 & 1);
        fStack_4a8 = (float)((uint)bVar70 * auVar83._24_4_ | (uint)!bVar70 * 2);
        fStack_4a4 = (float)((uint)(bVar63 >> 7) * auVar83._28_4_ | (uint)!(bool)(bVar63 >> 7) * 2);
        uVar16 = vpcmpd_avx512vl(_local_4c0,local_3e0,2);
        bVar63 = (byte)uVar16 & bVar58;
        if (bVar63 == 0) {
          auVar220 = ZEXT3264(local_740);
          auVar250 = ZEXT3264(auVar124);
          auVar238 = ZEXT3264(local_6e0);
        }
        else {
          auVar76 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar74 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar77 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar78 = vminps_avx(auVar76,auVar77);
          auVar76 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar77 = vmaxps_avx(auVar74,auVar76);
          auVar74 = vandps_avx(auVar78,auVar216);
          auVar76 = vandps_avx(auVar77,auVar216);
          auVar74 = vmaxps_avx(auVar74,auVar76);
          auVar76 = vmovshdup_avx(auVar74);
          auVar76 = vmaxss_avx(auVar76,auVar74);
          auVar74 = vshufpd_avx(auVar74,auVar74,1);
          auVar74 = vmaxss_avx(auVar74,auVar76);
          fVar225 = auVar74._0_4_ * 1.9073486e-06;
          local_670 = vshufps_avx(auVar77,auVar77,0xff);
          _local_560 = _local_280;
          local_4a0 = (float)local_4e0._0_4_ + (float)local_280._0_4_;
          fStack_49c = (float)local_4e0._4_4_ + (float)local_280._4_4_;
          fStack_498 = fStack_4d8 + fStack_278;
          fStack_494 = fStack_4d4 + fStack_274;
          fStack_490 = fStack_4d0 + fStack_270;
          fStack_48c = fStack_4cc + fStack_26c;
          fStack_488 = fStack_4c8 + fStack_268;
          fStack_484 = fStack_4c4 + fStack_264;
          do {
            auVar160._8_4_ = 0x7f800000;
            auVar160._0_8_ = 0x7f8000007f800000;
            auVar160._12_4_ = 0x7f800000;
            auVar160._16_4_ = 0x7f800000;
            auVar160._20_4_ = 0x7f800000;
            auVar160._24_4_ = 0x7f800000;
            auVar160._28_4_ = 0x7f800000;
            auVar83 = vblendmps_avx512vl(auVar160,_local_560);
            auVar136._0_4_ =
                 (uint)(bVar63 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar63 & 1) * 0x7f800000;
            bVar70 = (bool)(bVar63 >> 1 & 1);
            auVar136._4_4_ = (uint)bVar70 * auVar83._4_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar63 >> 2 & 1);
            auVar136._8_4_ = (uint)bVar70 * auVar83._8_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar63 >> 3 & 1);
            auVar136._12_4_ = (uint)bVar70 * auVar83._12_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar63 >> 4 & 1);
            auVar136._16_4_ = (uint)bVar70 * auVar83._16_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar63 >> 5 & 1);
            auVar136._20_4_ = (uint)bVar70 * auVar83._20_4_ | (uint)!bVar70 * 0x7f800000;
            auVar136._24_4_ =
                 (uint)(bVar63 >> 6) * auVar83._24_4_ | (uint)!(bool)(bVar63 >> 6) * 0x7f800000;
            auVar136._28_4_ = 0x7f800000;
            auVar83 = vshufps_avx(auVar136,auVar136,0xb1);
            auVar83 = vminps_avx(auVar136,auVar83);
            auVar97 = vshufpd_avx(auVar83,auVar83,5);
            auVar83 = vminps_avx(auVar83,auVar97);
            auVar97 = vpermpd_avx2(auVar83,0x4e);
            auVar83 = vminps_avx(auVar83,auVar97);
            uVar16 = vcmpps_avx512vl(auVar136,auVar83,0);
            bVar66 = (byte)uVar16 & bVar63;
            bVar62 = bVar63;
            if (bVar66 != 0) {
              bVar62 = bVar66;
            }
            iVar19 = 0;
            for (uVar61 = (uint)bVar62; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            bVar62 = '\x01' << ((byte)iVar19 & 0x1f);
            fVar232 = *(float *)(local_480 + (uint)(iVar19 << 2));
            fVar233 = *(float *)(local_260 + (uint)(iVar19 << 2));
            fVar234 = auVar13._0_4_;
            if ((float)local_700._0_4_ < 0.0) {
              fVar234 = sqrtf((float)local_700._0_4_);
            }
            bVar66 = ~bVar62;
            lVar68 = 5;
            do {
              auVar149._4_4_ = fVar233;
              auVar149._0_4_ = fVar233;
              auVar149._8_4_ = fVar233;
              auVar149._12_4_ = fVar233;
              auVar76 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_6f0);
              fVar240 = 1.0 - fVar232;
              auVar190._0_4_ = local_5c0._0_4_ * fVar232;
              auVar190._4_4_ = local_5c0._4_4_ * fVar232;
              auVar190._8_4_ = local_5c0._8_4_ * fVar232;
              auVar190._12_4_ = local_5c0._12_4_ * fVar232;
              local_610 = ZEXT416((uint)fVar240);
              auVar208._4_4_ = fVar240;
              auVar208._0_4_ = fVar240;
              auVar208._8_4_ = fVar240;
              auVar208._12_4_ = fVar240;
              auVar74 = vfmadd231ps_fma(auVar190,auVar208,local_580._0_16_);
              auVar217._0_4_ = local_5a0._0_4_ * fVar232;
              auVar217._4_4_ = local_5a0._4_4_ * fVar232;
              auVar217._8_4_ = local_5a0._8_4_ * fVar232;
              auVar217._12_4_ = local_5a0._12_4_ * fVar232;
              auVar77 = vfmadd231ps_fma(auVar217,auVar208,local_5c0._0_16_);
              auVar223._0_4_ = fVar232 * (float)local_5e0._0_4_;
              auVar223._4_4_ = fVar232 * (float)local_5e0._4_4_;
              auVar223._8_4_ = fVar232 * fStack_5d8;
              auVar223._12_4_ = fVar232 * fStack_5d4;
              auVar78 = vfmadd231ps_fma(auVar223,auVar208,local_5a0._0_16_);
              auVar230._0_4_ = fVar232 * auVar77._0_4_;
              auVar230._4_4_ = fVar232 * auVar77._4_4_;
              auVar230._8_4_ = fVar232 * auVar77._8_4_;
              auVar230._12_4_ = fVar232 * auVar77._12_4_;
              auVar74 = vfmadd231ps_fma(auVar230,auVar208,auVar74);
              auVar191._0_4_ = fVar232 * auVar78._0_4_;
              auVar191._4_4_ = fVar232 * auVar78._4_4_;
              auVar191._8_4_ = fVar232 * auVar78._8_4_;
              auVar191._12_4_ = fVar232 * auVar78._12_4_;
              auVar77 = vfmadd231ps_fma(auVar191,auVar208,auVar77);
              auVar218._0_4_ = fVar232 * auVar77._0_4_;
              auVar218._4_4_ = fVar232 * auVar77._4_4_;
              auVar218._8_4_ = fVar232 * auVar77._8_4_;
              auVar218._12_4_ = fVar232 * auVar77._12_4_;
              auVar78 = vfmadd231ps_fma(auVar218,auVar74,auVar208);
              auVar74 = vsubps_avx(auVar77,auVar74);
              auVar23._8_4_ = 0x40400000;
              auVar23._0_8_ = 0x4040000040400000;
              auVar23._12_4_ = 0x40400000;
              auVar77 = vmulps_avx512vl(auVar74,auVar23);
              local_540._0_16_ = auVar78;
              auVar74 = vsubps_avx(auVar76,auVar78);
              local_720._0_16_ = auVar74;
              auVar74 = vdpps_avx(auVar74,auVar74,0x7f);
              local_6c0._0_16_ = auVar74;
              local_9c0 = ZEXT416((uint)fVar232);
              if (auVar74._0_4_ < 0.0) {
                auVar238._0_4_ = sqrtf(auVar74._0_4_);
                auVar238._4_60_ = extraout_var_01;
                auVar74 = auVar238._0_16_;
              }
              else {
                auVar74 = vsqrtss_avx(auVar74,auVar74);
              }
              local_620 = vdpps_avx(auVar77,auVar77,0x7f);
              fVar240 = local_620._0_4_;
              auVar192._4_12_ = ZEXT812(0) << 0x20;
              auVar192._0_4_ = fVar240;
              auVar76 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar192);
              fVar235 = auVar76._0_4_;
              local_630 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar192);
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar78 = vxorps_avx512vl(local_620,auVar24);
              auVar76 = vfnmadd213ss_fma(local_630,local_620,ZEXT416(0x40000000));
              uVar61 = auVar74._0_4_;
              if (fVar240 < auVar78._0_4_) {
                auVar162._0_4_ = sqrtf(fVar240);
                auVar162._4_60_ = extraout_var_02;
                auVar74 = ZEXT416(uVar61);
                auVar78 = auVar162._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx512f(local_620,local_620);
              }
              fVar240 = fVar235 * 1.5 + fVar240 * -0.5 * fVar235 * fVar235 * fVar235;
              local_640._0_4_ = auVar77._0_4_ * fVar240;
              local_640._4_4_ = auVar77._4_4_ * fVar240;
              local_640._8_4_ = auVar77._8_4_ * fVar240;
              local_640._12_4_ = auVar77._12_4_ * fVar240;
              auVar1 = vdpps_avx(local_720._0_16_,local_640,0x7f);
              auVar79 = vaddss_avx512f(auVar74,ZEXT416(0x3f800000));
              auVar150._0_4_ = auVar1._0_4_ * auVar1._0_4_;
              auVar150._4_4_ = auVar1._4_4_ * auVar1._4_4_;
              auVar150._8_4_ = auVar1._8_4_ * auVar1._8_4_;
              auVar150._12_4_ = auVar1._12_4_ * auVar1._12_4_;
              auVar75 = vsubps_avx(local_6c0._0_16_,auVar150);
              fVar235 = auVar75._0_4_;
              auVar170._4_12_ = ZEXT812(0) << 0x20;
              auVar170._0_4_ = fVar235;
              auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar170);
              fVar204 = auVar80._0_4_;
              uVar71 = fVar235 == 0.0;
              uVar69 = fVar235 < 0.0;
              if ((bool)uVar69) {
                local_650 = fVar240;
                fStack_64c = fVar240;
                fStack_648 = fVar240;
                fStack_644 = fVar240;
                fVar236 = sqrtf(fVar235);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar74 = ZEXT416(uVar61);
                auVar79 = ZEXT416(auVar79._0_4_);
                fVar240 = local_650;
                fVar244 = fStack_64c;
                fVar245 = fStack_648;
                fVar246 = fStack_644;
              }
              else {
                auVar75 = vsqrtss_avx(auVar75,auVar75);
                fVar236 = auVar75._0_4_;
                fVar244 = fVar240;
                fVar245 = fVar240;
                fVar246 = fVar240;
              }
              auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar250 = ZEXT3264(auVar83);
              auVar238 = ZEXT3264(local_6e0);
              auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9c0,local_610);
              fVar163 = auVar75._0_4_ * 6.0;
              fVar15 = fVar232 * 6.0;
              auVar193._0_4_ = fVar15 * (float)local_5e0._0_4_;
              auVar193._4_4_ = fVar15 * (float)local_5e0._4_4_;
              auVar193._8_4_ = fVar15 * fStack_5d8;
              auVar193._12_4_ = fVar15 * fStack_5d4;
              auVar171._4_4_ = fVar163;
              auVar171._0_4_ = fVar163;
              auVar171._8_4_ = fVar163;
              auVar171._12_4_ = fVar163;
              auVar75 = vfmadd132ps_fma(auVar171,auVar193,local_5a0._0_16_);
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_610,local_9c0);
              fVar163 = auVar80._0_4_ * 6.0;
              auVar194._4_4_ = fVar163;
              auVar194._0_4_ = fVar163;
              auVar194._8_4_ = fVar163;
              auVar194._12_4_ = fVar163;
              auVar75 = vfmadd132ps_fma(auVar194,auVar75,local_5c0._0_16_);
              fVar163 = local_610._0_4_ * 6.0;
              auVar172._4_4_ = fVar163;
              auVar172._0_4_ = fVar163;
              auVar172._8_4_ = fVar163;
              auVar172._12_4_ = fVar163;
              auVar75 = vfmadd132ps_fma(auVar172,auVar75,local_580._0_16_);
              auVar195._0_4_ = auVar75._0_4_ * (float)local_620._0_4_;
              auVar195._4_4_ = auVar75._4_4_ * (float)local_620._0_4_;
              auVar195._8_4_ = auVar75._8_4_ * (float)local_620._0_4_;
              auVar195._12_4_ = auVar75._12_4_ * (float)local_620._0_4_;
              auVar75 = vdpps_avx(auVar77,auVar75,0x7f);
              fVar163 = auVar75._0_4_;
              auVar173._0_4_ = auVar77._0_4_ * fVar163;
              auVar173._4_4_ = auVar77._4_4_ * fVar163;
              auVar173._8_4_ = auVar77._8_4_ * fVar163;
              auVar173._12_4_ = auVar77._12_4_ * fVar163;
              auVar80 = vsubps_avx(auVar195,auVar173);
              fVar163 = auVar76._0_4_ * (float)local_630._0_4_;
              auVar75 = vmaxss_avx(ZEXT416((uint)fVar225),
                                   ZEXT416((uint)(fVar233 * fVar234 * 1.9073486e-06)));
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(auVar77,auVar25);
              auVar196._0_4_ = fVar240 * auVar80._0_4_ * fVar163;
              auVar196._4_4_ = fVar244 * auVar80._4_4_ * fVar163;
              auVar196._8_4_ = fVar245 * auVar80._8_4_ * fVar163;
              auVar196._12_4_ = fVar246 * auVar80._12_4_ * fVar163;
              auVar76 = vdpps_avx(auVar81,local_640,0x7f);
              auVar80 = vdivss_avx512f(ZEXT416((uint)fVar225),auVar78);
              auVar78 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar225),auVar75);
              auVar74 = vdpps_avx(local_720._0_16_,auVar196,0x7f);
              vfmadd213ss_avx512f(auVar79,auVar80,auVar78);
              fVar240 = auVar76._0_4_ + auVar74._0_4_;
              auVar74 = vdpps_avx(local_6f0,local_640,0x7f);
              auVar76 = vdpps_avx(local_720._0_16_,auVar81,0x7f);
              fVar235 = fVar204 * fVar235 * -0.5 * fVar204 * fVar204 + fVar204 * 1.5;
              auVar78 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
              in_ZMM31 = ZEXT1664(auVar1);
              auVar79 = vfnmadd231ss_avx512f(auVar76,auVar1,ZEXT416((uint)fVar240));
              auVar80 = vfnmadd231ss_avx512f(auVar78,auVar1,auVar74);
              auVar76 = vpermilps_avx(local_540._0_16_,0xff);
              fVar236 = fVar236 - auVar76._0_4_;
              auVar76 = vshufps_avx(auVar77,auVar77,0xff);
              auVar78 = vfmsub213ss_fma(auVar79,ZEXT416((uint)fVar235),auVar76);
              fVar235 = auVar80._0_4_ * fVar235;
              auVar79 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar78._0_4_)),
                                        ZEXT416((uint)fVar240),ZEXT416((uint)fVar235));
              fVar204 = auVar79._0_4_;
              auVar231._0_4_ = fVar235 / fVar204;
              auVar231._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar209._0_4_ = auVar78._0_4_ / fVar204;
              auVar209._4_12_ = auVar78._4_12_;
              auVar78 = vmulss_avx512f(auVar1,auVar231);
              auVar79 = vmulss_avx512f(auVar1,auVar209);
              fVar232 = fVar232 - (auVar78._0_4_ - fVar236 * (auVar74._0_4_ / fVar204));
              fVar233 = fVar233 - (fVar236 * (fVar240 / fVar204) - auVar79._0_4_);
              auVar219._8_4_ = 0x7fffffff;
              auVar219._0_8_ = 0x7fffffff7fffffff;
              auVar219._12_4_ = 0x7fffffff;
              auVar74 = vandps_avx512vl(auVar1,auVar219);
              auVar74 = vucomiss_avx512f(auVar74);
              bVar70 = true;
              if ((bool)uVar69 || (bool)uVar71) {
LAB_01d7dc1b:
                auVar220 = ZEXT3264(local_740);
              }
              else {
                auVar74 = vaddss_avx512f(auVar75,auVar74);
                auVar78 = vfmadd231ss_fma(auVar74,local_670,ZEXT416(0x36000000));
                auVar74 = vandps_avx(ZEXT416((uint)fVar236),auVar219);
                if (auVar78._0_4_ <= auVar74._0_4_) goto LAB_01d7dc1b;
                fVar233 = fVar233 + (float)local_660._0_4_;
                auVar220 = ZEXT3264(local_740);
                if ((((fVar233 < fVar145) ||
                     (fVar240 = *(float *)(ray + k * 4 + 0x100), fVar240 < fVar233)) ||
                    (fVar232 < 0.0)) || (1.0 < fVar232)) {
LAB_01d7dc16:
                  bVar70 = false;
                  bVar62 = 0;
                }
                else {
                  auVar47._12_4_ = 0;
                  auVar47._0_12_ = ZEXT812(0);
                  auVar74 = vrsqrt14ss_avx512f(auVar47 << 0x20,ZEXT416((uint)local_6c0._0_4_));
                  fVar235 = auVar74._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar67].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_01d7dc16;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar62 = true;
                  }
                  else {
                    fVar235 = fVar235 * 1.5 +
                              (float)local_6c0._0_4_ * -0.5 * fVar235 * fVar235 * fVar235;
                    auVar174._0_4_ = local_720._0_4_ * fVar235;
                    auVar174._4_4_ = local_720._4_4_ * fVar235;
                    auVar174._8_4_ = local_720._8_4_ * fVar235;
                    auVar174._12_4_ = local_720._12_4_ * fVar235;
                    auVar78 = vfmadd213ps_fma(auVar76,auVar174,auVar77);
                    auVar74 = vshufps_avx(auVar174,auVar174,0xc9);
                    auVar76 = vshufps_avx(auVar77,auVar77,0xc9);
                    auVar175._0_4_ = auVar174._0_4_ * auVar76._0_4_;
                    auVar175._4_4_ = auVar174._4_4_ * auVar76._4_4_;
                    auVar175._8_4_ = auVar174._8_4_ * auVar76._8_4_;
                    auVar175._12_4_ = auVar174._12_4_ * auVar76._12_4_;
                    auVar77 = vfmsub231ps_fma(auVar175,auVar77,auVar74);
                    auVar74 = vshufps_avx(auVar77,auVar77,0xc9);
                    auVar76 = vshufps_avx(auVar78,auVar78,0xc9);
                    auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                    auVar151._0_4_ = auVar78._0_4_ * auVar77._0_4_;
                    auVar151._4_4_ = auVar78._4_4_ * auVar77._4_4_;
                    auVar151._8_4_ = auVar78._8_4_ * auVar77._8_4_;
                    auVar151._12_4_ = auVar78._12_4_ * auVar77._12_4_;
                    auVar74 = vfmsub231ps_fma(auVar151,auVar74,auVar76);
                    auVar201._8_4_ = 1;
                    auVar201._0_8_ = 0x100000001;
                    auVar201._12_4_ = 1;
                    auVar201._16_4_ = 1;
                    auVar201._20_4_ = 1;
                    auVar201._24_4_ = 1;
                    auVar201._28_4_ = 1;
                    auVar83 = vpermps_avx2(auVar201,ZEXT1632(auVar74));
                    auVar211._8_4_ = 2;
                    auVar211._0_8_ = 0x200000002;
                    auVar211._12_4_ = 2;
                    auVar211._16_4_ = 2;
                    auVar211._20_4_ = 2;
                    auVar211._24_4_ = 2;
                    auVar211._28_4_ = 2;
                    local_380 = vpermps_avx2(auVar211,ZEXT1632(auVar74));
                    local_360 = auVar74._0_4_;
                    local_3a0[0] = (RTCHitN)auVar83[0];
                    local_3a0[1] = (RTCHitN)auVar83[1];
                    local_3a0[2] = (RTCHitN)auVar83[2];
                    local_3a0[3] = (RTCHitN)auVar83[3];
                    local_3a0[4] = (RTCHitN)auVar83[4];
                    local_3a0[5] = (RTCHitN)auVar83[5];
                    local_3a0[6] = (RTCHitN)auVar83[6];
                    local_3a0[7] = (RTCHitN)auVar83[7];
                    local_3a0[8] = (RTCHitN)auVar83[8];
                    local_3a0[9] = (RTCHitN)auVar83[9];
                    local_3a0[10] = (RTCHitN)auVar83[10];
                    local_3a0[0xb] = (RTCHitN)auVar83[0xb];
                    local_3a0[0xc] = (RTCHitN)auVar83[0xc];
                    local_3a0[0xd] = (RTCHitN)auVar83[0xd];
                    local_3a0[0xe] = (RTCHitN)auVar83[0xe];
                    local_3a0[0xf] = (RTCHitN)auVar83[0xf];
                    local_3a0[0x10] = (RTCHitN)auVar83[0x10];
                    local_3a0[0x11] = (RTCHitN)auVar83[0x11];
                    local_3a0[0x12] = (RTCHitN)auVar83[0x12];
                    local_3a0[0x13] = (RTCHitN)auVar83[0x13];
                    local_3a0[0x14] = (RTCHitN)auVar83[0x14];
                    local_3a0[0x15] = (RTCHitN)auVar83[0x15];
                    local_3a0[0x16] = (RTCHitN)auVar83[0x16];
                    local_3a0[0x17] = (RTCHitN)auVar83[0x17];
                    local_3a0[0x18] = (RTCHitN)auVar83[0x18];
                    local_3a0[0x19] = (RTCHitN)auVar83[0x19];
                    local_3a0[0x1a] = (RTCHitN)auVar83[0x1a];
                    local_3a0[0x1b] = (RTCHitN)auVar83[0x1b];
                    local_3a0[0x1c] = (RTCHitN)auVar83[0x1c];
                    local_3a0[0x1d] = (RTCHitN)auVar83[0x1d];
                    local_3a0[0x1e] = (RTCHitN)auVar83[0x1e];
                    local_3a0[0x1f] = (RTCHitN)auVar83[0x1f];
                    uStack_35c = local_360;
                    uStack_358 = local_360;
                    uStack_354 = local_360;
                    uStack_350 = local_360;
                    uStack_34c = local_360;
                    uStack_348 = local_360;
                    uStack_344 = local_360;
                    local_340 = fVar232;
                    fStack_33c = fVar232;
                    fStack_338 = fVar232;
                    fStack_334 = fVar232;
                    fStack_330 = fVar232;
                    fStack_32c = fVar232;
                    fStack_328 = fVar232;
                    fStack_324 = fVar232;
                    local_320 = ZEXT432(0) << 0x20;
                    local_300 = local_400._0_8_;
                    uStack_2f8 = local_400._8_8_;
                    uStack_2f0 = local_400._16_8_;
                    uStack_2e8 = local_400._24_8_;
                    local_2e0 = local_420;
                    vpcmpeqd_avx2(local_420,local_420);
                    local_2c0 = context->user->instID[0];
                    uStack_2bc = local_2c0;
                    uStack_2b8 = local_2c0;
                    uStack_2b4 = local_2c0;
                    uStack_2b0 = local_2c0;
                    uStack_2ac = local_2c0;
                    uStack_2a8 = local_2c0;
                    uStack_2a4 = local_2c0;
                    local_2a0 = context->user->instPrimID[0];
                    uStack_29c = local_2a0;
                    uStack_298 = local_2a0;
                    uStack_294 = local_2a0;
                    uStack_290 = local_2a0;
                    uStack_28c = local_2a0;
                    uStack_288 = local_2a0;
                    uStack_284 = local_2a0;
                    *(float *)(ray + k * 4 + 0x100) = fVar233;
                    local_6a0 = local_440._0_8_;
                    uStack_698 = local_440._8_8_;
                    uStack_690 = local_440._16_8_;
                    uStack_688 = local_440._24_8_;
                    local_770.valid = (int *)&local_6a0;
                    local_770.geometryUserPtr = pGVar3->userPtr;
                    local_770.context = context->user;
                    local_770.hit = local_3a0;
                    local_770.N = 8;
                    local_770.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->occlusionFilterN)(&local_770);
                      auVar220 = ZEXT3264(local_740);
                      auVar238 = ZEXT3264(local_6e0);
                      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar250 = ZEXT3264(auVar83);
                    }
                    auVar50._8_8_ = uStack_698;
                    auVar50._0_8_ = local_6a0;
                    auVar50._16_8_ = uStack_690;
                    auVar50._24_8_ = uStack_688;
                    if (auVar50 == (undefined1  [32])0x0) {
                      bVar62 = false;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&local_770);
                        auVar220 = ZEXT3264(local_740);
                        auVar238 = ZEXT3264(local_6e0);
                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar250 = ZEXT3264(auVar83);
                      }
                      auVar51._8_8_ = uStack_698;
                      auVar51._0_8_ = local_6a0;
                      auVar51._16_8_ = uStack_690;
                      auVar51._24_8_ = uStack_688;
                      uVar73 = vptestmd_avx512vl(auVar51,auVar51);
                      auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar70 = (bool)((byte)uVar73 & 1);
                      bVar6 = (bool)((byte)(uVar73 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar73 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar73 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar73 >> 4) & 1);
                      bVar9 = (bool)((byte)(uVar73 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar73 >> 6) & 1);
                      bVar12 = SUB81(uVar73 >> 7,0);
                      *(uint *)(local_770.ray + 0x100) =
                           (uint)bVar70 * auVar83._0_4_ |
                           (uint)!bVar70 * *(int *)(local_770.ray + 0x100);
                      *(uint *)(local_770.ray + 0x104) =
                           (uint)bVar6 * auVar83._4_4_ |
                           (uint)!bVar6 * *(int *)(local_770.ray + 0x104);
                      *(uint *)(local_770.ray + 0x108) =
                           (uint)bVar7 * auVar83._8_4_ |
                           (uint)!bVar7 * *(int *)(local_770.ray + 0x108);
                      *(uint *)(local_770.ray + 0x10c) =
                           (uint)bVar8 * auVar83._12_4_ |
                           (uint)!bVar8 * *(int *)(local_770.ray + 0x10c);
                      *(uint *)(local_770.ray + 0x110) =
                           (uint)bVar10 * auVar83._16_4_ |
                           (uint)!bVar10 * *(int *)(local_770.ray + 0x110);
                      *(uint *)(local_770.ray + 0x114) =
                           (uint)bVar9 * auVar83._20_4_ |
                           (uint)!bVar9 * *(int *)(local_770.ray + 0x114);
                      *(uint *)(local_770.ray + 0x118) =
                           (uint)bVar11 * auVar83._24_4_ |
                           (uint)!bVar11 * *(int *)(local_770.ray + 0x118);
                      *(uint *)(local_770.ray + 0x11c) =
                           (uint)bVar12 * auVar83._28_4_ |
                           (uint)!bVar12 * *(int *)(local_770.ray + 0x11c);
                      bVar62 = auVar51 != (undefined1  [32])0x0;
                    }
                    if ((bool)bVar62 == false) {
                      *(float *)(ray + k * 4 + 0x100) = fVar240;
                    }
                  }
                  bVar70 = false;
                }
              }
              if (!bVar70) goto LAB_01d7e064;
              lVar68 = lVar68 + -1;
            } while (lVar68 != 0);
            bVar62 = 0;
LAB_01d7e064:
            bVar65 = bVar65 | bVar62 & 1;
            auVar53._4_4_ = fStack_49c;
            auVar53._0_4_ = local_4a0;
            auVar53._8_4_ = fStack_498;
            auVar53._12_4_ = fStack_494;
            auVar53._16_4_ = fStack_490;
            auVar53._20_4_ = fStack_48c;
            auVar53._24_4_ = fStack_488;
            auVar53._28_4_ = fStack_484;
            uVar205 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar34._4_4_ = uVar205;
            auVar34._0_4_ = uVar205;
            auVar34._8_4_ = uVar205;
            auVar34._12_4_ = uVar205;
            auVar34._16_4_ = uVar205;
            auVar34._20_4_ = uVar205;
            auVar34._24_4_ = uVar205;
            auVar34._28_4_ = uVar205;
            uVar16 = vcmpps_avx512vl(auVar53,auVar34,2);
            bVar63 = bVar66 & bVar63 & (byte)uVar16;
          } while (bVar63 != 0);
        }
        uVar18 = vpcmpd_avx512vl(local_3e0,_local_4c0,1);
        uVar17 = vpcmpd_avx512vl(local_3e0,local_240,1);
        auVar177._0_4_ = (float)local_4e0._0_4_ + (float)local_1c0._0_4_;
        auVar177._4_4_ = (float)local_4e0._4_4_ + (float)local_1c0._4_4_;
        auVar177._8_4_ = fStack_4d8 + fStack_1b8;
        auVar177._12_4_ = fStack_4d4 + fStack_1b4;
        auVar177._16_4_ = fStack_4d0 + fStack_1b0;
        auVar177._20_4_ = fStack_4cc + fStack_1ac;
        auVar177._24_4_ = fStack_4c8 + fStack_1a8;
        auVar177._28_4_ = fStack_4c4 + fStack_1a4;
        uVar205 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar202._4_4_ = uVar205;
        auVar202._0_4_ = uVar205;
        auVar202._8_4_ = uVar205;
        auVar202._12_4_ = uVar205;
        auVar202._16_4_ = uVar205;
        auVar202._20_4_ = uVar205;
        auVar202._24_4_ = uVar205;
        auVar202._28_4_ = uVar205;
        uVar16 = vcmpps_avx512vl(auVar177,auVar202,2);
        bVar57 = bVar57 & (byte)uVar17 & (byte)uVar16;
        auVar212._0_4_ = (float)local_4e0._0_4_ + (float)local_280._0_4_;
        auVar212._4_4_ = (float)local_4e0._4_4_ + (float)local_280._4_4_;
        auVar212._8_4_ = fStack_4d8 + fStack_278;
        auVar212._12_4_ = fStack_4d4 + fStack_274;
        auVar212._16_4_ = fStack_4d0 + fStack_270;
        auVar212._20_4_ = fStack_4cc + fStack_26c;
        auVar212._24_4_ = fStack_4c8 + fStack_268;
        auVar212._28_4_ = fStack_4c4 + fStack_264;
        uVar16 = vcmpps_avx512vl(auVar212,auVar202,2);
        bVar58 = bVar58 & (byte)uVar18 & (byte)uVar16 | bVar57;
        if (bVar58 == 0) {
          auVar213 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          auVar203 = ZEXT3264(local_600);
        }
        else {
          local_180[uVar56 * 0x60] = bVar58;
          bVar70 = (bool)(bVar57 >> 1 & 1);
          bVar6 = (bool)(bVar57 >> 2 & 1);
          bVar7 = (bool)(bVar57 >> 3 & 1);
          bVar8 = (bool)(bVar57 >> 4 & 1);
          bVar10 = (bool)(bVar57 >> 5 & 1);
          auStack_160[uVar56 * 0x18] =
               (uint)(bVar57 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar57 & 1) * local_280._0_4_;
          auStack_160[uVar56 * 0x18 + 1] =
               (uint)bVar70 * local_1c0._4_4_ | (uint)!bVar70 * local_280._4_4_;
          auStack_160[uVar56 * 0x18 + 2] =
               (uint)bVar6 * (int)fStack_1b8 | (uint)!bVar6 * (int)fStack_278;
          auStack_160[uVar56 * 0x18 + 3] =
               (uint)bVar7 * (int)fStack_1b4 | (uint)!bVar7 * (int)fStack_274;
          auStack_160[uVar56 * 0x18 + 4] =
               (uint)bVar8 * (int)fStack_1b0 | (uint)!bVar8 * (int)fStack_270;
          auStack_160[uVar56 * 0x18 + 5] =
               (uint)bVar10 * (int)fStack_1ac | (uint)!bVar10 * (int)fStack_26c;
          auStack_160[uVar56 * 0x18 + 6] =
               (uint)(bVar57 >> 6) * (int)fStack_1a8 | (uint)!(bool)(bVar57 >> 6) * (int)fStack_268;
          (&fStack_144)[uVar56 * 0x18] = fStack_264;
          uVar16 = vmovlps_avx(local_680);
          (&local_140)[uVar56 * 0xc] = uVar16;
          local_138[uVar56 * 0x18] = (float)((int)fVar64 + 1);
          uVar56 = (ulong)((int)uVar56 + 1);
          auVar213 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          auVar203 = ZEXT3264(local_600);
        }
      }
    }
    do {
      if ((int)uVar56 == 0) {
        if (bVar65 != 0) {
          return bVar72;
        }
        uVar205 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar36._4_4_ = uVar205;
        auVar36._0_4_ = uVar205;
        auVar36._8_4_ = uVar205;
        auVar36._12_4_ = uVar205;
        auVar36._16_4_ = uVar205;
        auVar36._20_4_ = uVar205;
        auVar36._24_4_ = uVar205;
        auVar36._28_4_ = uVar205;
        uVar16 = vcmpps_avx512vl(local_220,auVar36,2);
        uVar67 = (uint)uVar16 & (uint)uVar59 - 1 & (uint)uVar59;
        uVar59 = (ulong)uVar67;
        bVar72 = uVar67 != 0;
        if (!bVar72) {
          return bVar72;
        }
        goto LAB_01d7ba7b;
      }
      uVar73 = (ulong)((int)uVar56 - 1);
      auVar83 = *(undefined1 (*) [32])(auStack_160 + uVar73 * 0x18);
      auVar178._0_4_ = auVar83._0_4_ + (float)local_4e0._0_4_;
      auVar178._4_4_ = auVar83._4_4_ + (float)local_4e0._4_4_;
      auVar178._8_4_ = auVar83._8_4_ + fStack_4d8;
      auVar178._12_4_ = auVar83._12_4_ + fStack_4d4;
      auVar178._16_4_ = auVar83._16_4_ + fStack_4d0;
      auVar178._20_4_ = auVar83._20_4_ + fStack_4cc;
      auVar178._24_4_ = auVar83._24_4_ + fStack_4c8;
      auVar178._28_4_ = auVar83._28_4_ + fStack_4c4;
      uVar205 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar35._4_4_ = uVar205;
      auVar35._0_4_ = uVar205;
      auVar35._8_4_ = uVar205;
      auVar35._12_4_ = uVar205;
      auVar35._16_4_ = uVar205;
      auVar35._20_4_ = uVar205;
      auVar35._24_4_ = uVar205;
      auVar35._28_4_ = uVar205;
      uVar16 = vcmpps_avx512vl(auVar178,auVar35,2);
      uVar61 = (uint)uVar16 & (uint)local_180[uVar73 * 0x60];
      bVar58 = (byte)uVar61;
      if (uVar61 != 0) {
        auVar179._8_4_ = 0x7f800000;
        auVar179._0_8_ = 0x7f8000007f800000;
        auVar179._12_4_ = 0x7f800000;
        auVar179._16_4_ = 0x7f800000;
        auVar179._20_4_ = 0x7f800000;
        auVar179._24_4_ = 0x7f800000;
        auVar179._28_4_ = 0x7f800000;
        auVar97 = vblendmps_avx512vl(auVar179,auVar83);
        auVar137._0_4_ =
             (uint)(bVar58 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar58 & 1) * (int)auVar83._0_4_;
        bVar70 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar137._4_4_ = (uint)bVar70 * auVar97._4_4_ | (uint)!bVar70 * (int)auVar83._4_4_;
        bVar70 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar137._8_4_ = (uint)bVar70 * auVar97._8_4_ | (uint)!bVar70 * (int)auVar83._8_4_;
        bVar70 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar137._12_4_ = (uint)bVar70 * auVar97._12_4_ | (uint)!bVar70 * (int)auVar83._12_4_;
        bVar70 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar137._16_4_ = (uint)bVar70 * auVar97._16_4_ | (uint)!bVar70 * (int)auVar83._16_4_;
        bVar70 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar137._20_4_ = (uint)bVar70 * auVar97._20_4_ | (uint)!bVar70 * (int)auVar83._20_4_;
        bVar70 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar137._24_4_ = (uint)bVar70 * auVar97._24_4_ | (uint)!bVar70 * (int)auVar83._24_4_;
        auVar137._28_4_ =
             (uVar61 >> 7) * auVar97._28_4_ | (uint)!SUB41(uVar61 >> 7,0) * (int)auVar83._28_4_;
        auVar83 = vshufps_avx(auVar137,auVar137,0xb1);
        auVar83 = vminps_avx(auVar137,auVar83);
        auVar97 = vshufpd_avx(auVar83,auVar83,5);
        auVar83 = vminps_avx(auVar83,auVar97);
        auVar97 = vpermpd_avx2(auVar83,0x4e);
        auVar83 = vminps_avx(auVar83,auVar97);
        uVar16 = vcmpps_avx512vl(auVar137,auVar83,0);
        bVar63 = (byte)uVar16 & bVar58;
        if (bVar63 != 0) {
          uVar61 = (uint)bVar63;
        }
        fVar225 = local_138[uVar73 * 0x18 + -1];
        uVar138 = 0;
        for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
          uVar138 = uVar138 + 1;
        }
        fVar64 = local_138[uVar73 * 0x18];
        bVar63 = ~('\x01' << ((byte)uVar138 & 0x1f)) & bVar58;
        local_180[uVar73 * 0x60] = bVar63;
        auVar203 = ZEXT3264(local_600);
        uVar60 = uVar73;
        if (bVar63 != 0) {
          uVar60 = uVar56;
        }
        fVar232 = *(float *)(&local_140 + uVar73 * 0xc);
        auVar180._4_4_ = fVar232;
        auVar180._0_4_ = fVar232;
        auVar180._8_4_ = fVar232;
        auVar180._12_4_ = fVar232;
        auVar180._16_4_ = fVar232;
        auVar180._20_4_ = fVar232;
        auVar180._24_4_ = fVar232;
        auVar180._28_4_ = fVar232;
        fVar225 = fVar225 - fVar232;
        auVar161._4_4_ = fVar225;
        auVar161._0_4_ = fVar225;
        auVar161._8_4_ = fVar225;
        auVar161._12_4_ = fVar225;
        auVar161._16_4_ = fVar225;
        auVar161._20_4_ = fVar225;
        auVar161._24_4_ = fVar225;
        auVar161._28_4_ = fVar225;
        auVar74 = vfmadd132ps_fma(auVar161,auVar180,_DAT_02020f20);
        auVar83 = ZEXT1632(auVar74);
        local_3a0[0] = (RTCHitN)auVar83[0];
        local_3a0[1] = (RTCHitN)auVar83[1];
        local_3a0[2] = (RTCHitN)auVar83[2];
        local_3a0[3] = (RTCHitN)auVar83[3];
        local_3a0[4] = (RTCHitN)auVar83[4];
        local_3a0[5] = (RTCHitN)auVar83[5];
        local_3a0[6] = (RTCHitN)auVar83[6];
        local_3a0[7] = (RTCHitN)auVar83[7];
        local_3a0[8] = (RTCHitN)auVar83[8];
        local_3a0[9] = (RTCHitN)auVar83[9];
        local_3a0[10] = (RTCHitN)auVar83[10];
        local_3a0[0xb] = (RTCHitN)auVar83[0xb];
        local_3a0[0xc] = (RTCHitN)auVar83[0xc];
        local_3a0[0xd] = (RTCHitN)auVar83[0xd];
        local_3a0[0xe] = (RTCHitN)auVar83[0xe];
        local_3a0[0xf] = (RTCHitN)auVar83[0xf];
        local_3a0[0x10] = (RTCHitN)auVar83[0x10];
        local_3a0[0x11] = (RTCHitN)auVar83[0x11];
        local_3a0[0x12] = (RTCHitN)auVar83[0x12];
        local_3a0[0x13] = (RTCHitN)auVar83[0x13];
        local_3a0[0x14] = (RTCHitN)auVar83[0x14];
        local_3a0[0x15] = (RTCHitN)auVar83[0x15];
        local_3a0[0x16] = (RTCHitN)auVar83[0x16];
        local_3a0[0x17] = (RTCHitN)auVar83[0x17];
        local_3a0[0x18] = (RTCHitN)auVar83[0x18];
        local_3a0[0x19] = (RTCHitN)auVar83[0x19];
        local_3a0[0x1a] = (RTCHitN)auVar83[0x1a];
        local_3a0[0x1b] = (RTCHitN)auVar83[0x1b];
        local_3a0[0x1c] = (RTCHitN)auVar83[0x1c];
        local_3a0[0x1d] = (RTCHitN)auVar83[0x1d];
        local_3a0[0x1e] = (RTCHitN)auVar83[0x1e];
        local_3a0[0x1f] = (RTCHitN)auVar83[0x1f];
        local_680._8_8_ = 0;
        local_680._0_8_ = *(ulong *)(local_3a0 + (ulong)uVar138 * 4);
        uVar73 = uVar60;
      }
      uVar56 = uVar73;
    } while (bVar58 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }